

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx512.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_avx512_functor::unary_op_acos>(Mat *a,Option *opt)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  byte bVar7;
  bool bVar8;
  bool bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined8 uVar59;
  undefined8 uVar60;
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  uint uVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  uint uVar70;
  uint uVar71;
  uint uVar72;
  undefined1 auVar74 [32];
  undefined1 auVar73 [16];
  long *in_RDI;
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  float fVar77;
  __m128 _p_2;
  __m256 _p_1;
  __m512 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_acos op;
  Mat *m;
  __m512 big_final_approx;
  __m512 small_final_approx;
  __m512 x1;
  __m512 output_approx;
  __m512 fourth_power_of_input_approx;
  __m512 square_of_input_approx;
  __m512 input_approx;
  __m512 big_input_approx;
  __mmask16 is_small_input;
  __m512 absolute;
  __m512 negative_mask;
  __m512 magic_pi;
  __m512 magic_half_pi;
  __m512 magic_a1;
  __m512 magic_a0;
  __m512 magic_a3;
  __m512 magic_a2;
  __m512 magic_a5;
  __m512 magic_a4;
  __m512 magic_one;
  __m512 magic_half_one;
  __m512 magic_zero;
  __m512 magic_negative_zero;
  __m256 big_final_approx_1;
  __m256 small_final_approx_1;
  __m256 x1_1;
  __m256 output_approx_1;
  __m256 fourth_power_of_input_approx_1;
  __m256 square_of_input_approx_1;
  __m256 input_approx_1;
  __m256 big_input_approx_1;
  __m256 is_small_input_1;
  __m256 absolute_1;
  __m256 negative_mask_1;
  __m256 magic_pi_1;
  __m256 magic_half_pi_1;
  __m256 magic_a1_1;
  __m256 magic_a0_1;
  __m256 magic_a3_1;
  __m256 magic_a2_1;
  __m256 magic_a5_1;
  __m256 magic_a4_1;
  __m256 magic_one_1;
  __m256 magic_half_one_1;
  __m256 magic_zero_1;
  __m256 magic_negative_zero_1;
  __m128 big_final_approx_2;
  __m128 small_final_approx_2;
  __m128 x1_2;
  __m128 output_approx_2;
  __m128 fourth_power_of_input_approx_2;
  __m128 square_of_input_approx_2;
  __m128 input_approx_2;
  __m128 big_input_approx_2;
  __m128 is_small_input_2;
  __m128 absolute_2;
  __m128 negative_mask_2;
  __m128 magic_pi_2;
  __m128 magic_half_pi_2;
  __m128 magic_a1_2;
  __m128 magic_a0_2;
  __m128 magic_a3_2;
  __m128 magic_a2_2;
  __m128 magic_a5_2;
  __m128 magic_a4_2;
  __m128 magic_one_2;
  __m128 magic_half_one_2;
  __m128 magic_zero_2;
  __m128 magic_negative_zero_2;
  undefined1 local_30b0 [16];
  undefined1 local_30a0 [32];
  undefined8 local_3080;
  undefined8 uStack_3078;
  undefined8 uStack_3070;
  undefined8 uStack_3068;
  undefined8 uStack_3060;
  undefined8 uStack_3058;
  undefined8 uStack_3050;
  undefined8 uStack_3048;
  int local_303c;
  undefined8 local_3038;
  undefined8 local_3030;
  undefined8 local_3028;
  undefined4 local_3020;
  long local_3018;
  undefined4 local_3010;
  undefined4 local_300c;
  undefined4 local_3008;
  undefined4 local_3004;
  undefined4 local_3000;
  undefined8 local_2ff8;
  undefined1 (*local_2ff0) [64];
  int local_2fe8;
  int local_2fe4;
  int local_2fe0;
  int local_2fdc;
  int local_2fd8;
  int local_2fd4;
  int local_2fd0;
  undefined1 local_2fc9 [9];
  long *local_2fc0;
  undefined1 local_2fb5;
  int local_2fb4;
  undefined8 *local_2fa8;
  undefined8 *local_2fa0;
  undefined8 *local_2f90;
  undefined1 (*local_2f88) [64];
  undefined8 local_2f80;
  undefined8 uStack_2f78;
  undefined8 uStack_2f70;
  undefined8 uStack_2f68;
  undefined8 uStack_2f60;
  undefined8 uStack_2f58;
  undefined8 uStack_2f50;
  undefined8 uStack_2f48;
  undefined1 (*local_2f10) [64];
  undefined1 (*local_2f08) [64];
  undefined8 local_2f00;
  undefined8 uStack_2ef8;
  undefined8 uStack_2ef0;
  undefined8 uStack_2ee8;
  undefined1 (*local_2ee0) [64];
  undefined1 (*local_2ed8) [64];
  undefined8 local_2ed0;
  undefined8 uStack_2ec8;
  undefined1 (*local_2ec0) [64];
  long local_2eb8;
  undefined4 local_2eac;
  long local_2ea8;
  undefined1 (*local_2ea0) [64];
  undefined4 local_2e94;
  int local_2e90;
  int local_2e8c;
  undefined8 *local_2e88;
  undefined4 local_2e7c;
  long local_2e78;
  undefined8 *local_2e68;
  undefined8 *local_2e40;
  undefined1 *local_2e38;
  undefined1 *local_2e30;
  undefined1 *local_2e28;
  undefined1 *local_2e20;
  undefined1 *local_2e18;
  undefined1 (*local_2e10) [64];
  undefined1 *local_2e08;
  undefined1 local_2e00 [64];
  undefined1 local_2dc0 [64];
  undefined1 local_2d80 [64];
  undefined1 local_2d40 [64];
  undefined1 local_2d00 [64];
  undefined1 local_2cc0 [64];
  uint local_2c80;
  uint uStack_2c7c;
  uint uStack_2c78;
  uint uStack_2c74;
  uint uStack_2c70;
  uint uStack_2c6c;
  uint uStack_2c68;
  uint uStack_2c64;
  uint uStack_2c60;
  uint uStack_2c5c;
  uint uStack_2c58;
  uint uStack_2c54;
  uint uStack_2c50;
  uint uStack_2c4c;
  uint uStack_2c48;
  uint uStack_2c44;
  undefined1 local_2c40 [64];
  ushort local_2bc2;
  undefined1 local_2bc0 [64];
  undefined1 local_2b80 [64];
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  undefined8 uStack_2b20;
  undefined8 uStack_2b18;
  undefined8 uStack_2b10;
  undefined8 uStack_2b08;
  undefined8 local_2b00;
  undefined8 uStack_2af8;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  undefined8 uStack_2ae0;
  undefined8 uStack_2ad8;
  undefined8 uStack_2ad0;
  undefined8 uStack_2ac8;
  undefined8 local_2ac0;
  undefined8 uStack_2ab8;
  undefined8 uStack_2ab0;
  undefined8 uStack_2aa8;
  undefined8 uStack_2aa0;
  undefined8 uStack_2a98;
  undefined8 uStack_2a90;
  undefined8 uStack_2a88;
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  undefined8 uStack_2a60;
  undefined8 uStack_2a58;
  undefined8 uStack_2a50;
  undefined8 uStack_2a48;
  undefined8 local_2a40;
  undefined8 uStack_2a38;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  undefined8 uStack_2a20;
  undefined8 uStack_2a18;
  undefined8 uStack_2a10;
  undefined8 uStack_2a08;
  undefined8 local_2a00;
  undefined8 uStack_29f8;
  undefined8 uStack_29f0;
  undefined8 uStack_29e8;
  undefined8 uStack_29e0;
  undefined8 uStack_29d8;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  undefined8 uStack_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  undefined8 local_2980;
  undefined8 uStack_2978;
  undefined8 uStack_2970;
  undefined8 uStack_2968;
  undefined8 uStack_2960;
  undefined8 uStack_2958;
  undefined8 uStack_2950;
  undefined8 uStack_2948;
  undefined8 local_2940;
  undefined8 uStack_2938;
  undefined8 uStack_2930;
  undefined8 uStack_2928;
  undefined8 uStack_2920;
  undefined8 uStack_2918;
  undefined8 uStack_2910;
  undefined8 uStack_2908;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  undefined8 uStack_28e0;
  undefined8 uStack_28d8;
  undefined8 uStack_28d0;
  undefined8 uStack_28c8;
  undefined8 local_28c0;
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  undefined8 uStack_28a0;
  undefined8 uStack_2898;
  undefined8 uStack_2890;
  undefined8 uStack_2888;
  undefined8 local_2880;
  undefined8 uStack_2878;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  undefined8 uStack_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  undefined8 local_2840;
  undefined8 uStack_2838;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  undefined8 uStack_2820;
  undefined8 uStack_2818;
  undefined8 uStack_2810;
  undefined8 uStack_2808;
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  undefined8 uStack_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  undefined8 uStack_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  undefined1 local_2780 [64];
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined8 uStack_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined8 uStack_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  undefined8 uStack_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined8 uStack_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 uStack_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 uStack_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  undefined8 uStack_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined8 uStack_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  undefined8 uStack_2520;
  undefined8 uStack_2518;
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  undefined1 local_2500 [64];
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  undefined8 uStack_24a0;
  undefined8 uStack_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  undefined1 local_2480 [64];
  undefined1 local_2440 [64];
  undefined1 local_2400 [64];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined8 uStack_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined8 uStack_2360;
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  undefined1 local_2340 [64];
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined8 uStack_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  undefined8 uStack_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined8 uStack_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined8 uStack_2220;
  undefined8 uStack_2218;
  undefined8 uStack_2210;
  undefined8 uStack_2208;
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  undefined8 uStack_21e0;
  undefined8 uStack_21d8;
  undefined8 uStack_21d0;
  undefined8 uStack_21c8;
  undefined1 local_21c0 [64];
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 uStack_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined8 uStack_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined8 uStack_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined8 uStack_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  undefined1 local_2080 [64];
  int local_2040;
  int iStack_203c;
  int iStack_2038;
  int iStack_2034;
  int iStack_2030;
  int iStack_202c;
  int iStack_2028;
  int iStack_2024;
  int iStack_2020;
  int iStack_201c;
  int iStack_2018;
  int iStack_2014;
  int iStack_2010;
  int iStack_200c;
  int iStack_2008;
  int iStack_2004;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 uStack_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 uStack_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  undefined8 uStack_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined1 local_1f40 [64];
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 uStack_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined8 uStack_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined8 uStack_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 uStack_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined1 local_1e00 [64];
  undefined4 local_1d84;
  undefined1 local_1d80 [64];
  undefined4 local_1d04;
  undefined1 local_1d00 [64];
  undefined4 local_1c84;
  undefined1 local_1c80 [64];
  undefined4 local_1c04;
  undefined1 local_1c00 [64];
  undefined4 local_1b84;
  undefined1 local_1b80 [64];
  undefined4 local_1b04;
  undefined1 local_1b00 [64];
  undefined4 local_1a84;
  undefined1 local_1a80 [64];
  undefined4 local_1a04;
  undefined1 local_1a00 [64];
  undefined4 local_1984;
  undefined1 local_1980 [64];
  undefined4 local_1904;
  undefined1 local_1900 [64];
  undefined4 local_1884;
  undefined1 local_1880 [64];
  undefined4 local_1804;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 uStack_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  ushort local_1782;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 uStack_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 uStack_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  ushort local_16c2;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 uStack_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 uStack_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  ushort local_1602;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 uStack_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  float local_15c0;
  float fStack_15bc;
  float fStack_15b8;
  float fStack_15b4;
  float fStack_15b0;
  float fStack_15ac;
  float fStack_15a8;
  float fStack_15a4;
  undefined1 local_15a0 [32];
  float local_1580;
  float fStack_157c;
  float fStack_1578;
  float fStack_1574;
  float fStack_1570;
  float fStack_156c;
  float fStack_1568;
  undefined4 uStack_1564;
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  float local_14c0;
  float fStack_14bc;
  float fStack_14b8;
  float fStack_14b4;
  float fStack_14b0;
  float fStack_14ac;
  float fStack_14a8;
  undefined4 uStack_14a4;
  float local_14a0;
  float fStack_149c;
  float fStack_1498;
  float fStack_1494;
  float fStack_1490;
  float fStack_148c;
  float fStack_1488;
  undefined4 uStack_1484;
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined1 local_11e0 [32];
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined1 local_1140 [32];
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined1 local_1000 [8];
  float fStack_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float fStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  float local_fc0;
  float fStack_fbc;
  float fStack_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float fStack_fa8;
  undefined4 uStack_fa4;
  undefined1 *local_f98;
  undefined1 *local_f90;
  float *local_f88;
  undefined8 *local_f80;
  undefined1 *local_f78;
  float *local_f70;
  undefined8 *local_f68;
  undefined8 *local_f60;
  float *local_f58;
  undefined8 *local_f50;
  undefined1 *local_f48;
  float *local_f40;
  undefined8 *local_f38;
  undefined8 *local_f30;
  float *local_f28;
  undefined1 local_f20 [8];
  float fStack_f18;
  float fStack_f14;
  float fStack_f10;
  float fStack_f0c;
  float fStack_f08;
  float fStack_f04;
  undefined1 local_f00 [8];
  float fStack_ef8;
  float fStack_ef4;
  float fStack_ef0;
  float fStack_eec;
  float fStack_ee8;
  float fStack_ee4;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  ulong uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  ulong uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined1 local_cc0 [32];
  undefined1 local_ca0 [32];
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  float local_c60;
  float fStack_c5c;
  float fStack_c58;
  float fStack_c54;
  float fStack_c50;
  float fStack_c4c;
  float fStack_c48;
  undefined4 uStack_c44;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  ulong uStack_c08;
  undefined1 local_c00 [32];
  undefined1 local_be0 [32];
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined4 local_af0;
  undefined4 local_aec;
  undefined4 local_ae8;
  undefined4 local_ae4;
  undefined4 local_ae0;
  undefined4 local_adc;
  undefined4 local_ad8;
  undefined4 local_ad4;
  undefined4 local_ad0;
  undefined4 local_acc;
  undefined4 local_ac8;
  undefined4 local_ac4;
  undefined1 local_ac0 [16];
  undefined1 auStack_ab0 [16];
  undefined4 local_aa0;
  undefined4 local_a9c;
  undefined4 local_a98;
  undefined4 local_a94;
  undefined4 local_a90;
  undefined4 local_a8c;
  undefined4 local_a88;
  undefined4 local_a84;
  undefined1 local_a80 [16];
  undefined1 auStack_a70 [16];
  undefined4 local_a60;
  undefined4 local_a5c;
  undefined4 local_a58;
  undefined4 local_a54;
  undefined4 local_a50;
  undefined4 local_a4c;
  undefined4 local_a48;
  undefined4 local_a44;
  undefined1 local_a40 [16];
  undefined1 auStack_a30 [16];
  undefined4 local_a20;
  undefined4 local_a1c;
  undefined4 local_a18;
  undefined4 local_a14;
  undefined4 local_a10;
  undefined4 local_a0c;
  undefined4 local_a08;
  undefined4 local_a04;
  undefined1 local_a00 [16];
  undefined1 auStack_9f0 [16];
  undefined4 local_9e0;
  undefined4 local_9dc;
  undefined4 local_9d8;
  undefined4 local_9d4;
  undefined4 local_9d0;
  undefined4 local_9cc;
  undefined4 local_9c8;
  undefined4 local_9c4;
  undefined1 local_9c0 [16];
  undefined1 auStack_9b0 [16];
  undefined4 local_9a0;
  undefined4 local_99c;
  undefined4 local_998;
  undefined4 local_994;
  undefined4 local_990;
  undefined4 local_98c;
  undefined4 local_988;
  undefined4 local_984;
  undefined1 local_980 [16];
  undefined1 auStack_970 [16];
  undefined4 local_960;
  undefined4 local_95c;
  undefined4 local_958;
  undefined4 local_954;
  undefined4 local_950;
  undefined4 local_94c;
  undefined4 local_948;
  undefined4 local_944;
  undefined1 local_940 [16];
  undefined1 auStack_930 [16];
  undefined4 local_920;
  undefined4 local_91c;
  undefined4 local_918;
  undefined4 local_914;
  undefined4 local_910;
  undefined4 local_90c;
  undefined4 local_908;
  undefined4 local_904;
  undefined1 local_900 [16];
  undefined1 auStack_8f0 [16];
  undefined4 local_8e0;
  undefined4 local_8dc;
  undefined4 local_8d8;
  undefined4 local_8d4;
  undefined4 local_8d0;
  undefined4 local_8cc;
  undefined4 local_8c8;
  undefined4 local_8c4;
  undefined1 local_8c0 [16];
  undefined1 auStack_8b0 [16];
  undefined4 local_8a0;
  undefined4 local_89c;
  undefined4 local_898;
  undefined4 local_894;
  undefined4 local_890;
  undefined4 local_88c;
  undefined4 local_888;
  undefined4 local_884;
  undefined1 local_880 [16];
  undefined1 auStack_870 [16];
  undefined4 local_860;
  undefined4 local_85c;
  undefined4 local_858;
  undefined4 local_854;
  undefined4 local_850;
  undefined4 local_84c;
  undefined4 local_848;
  undefined4 local_844;
  undefined1 local_840 [16];
  undefined1 auStack_830 [16];
  undefined4 local_820;
  undefined4 local_81c;
  undefined4 local_818;
  undefined4 local_814;
  undefined4 local_810;
  undefined4 local_80c;
  undefined4 local_808;
  undefined4 local_804;
  undefined1 local_800 [16];
  undefined1 auStack_7f0 [16];
  undefined4 local_7e0;
  undefined4 local_7dc;
  undefined4 local_7d8;
  undefined4 local_7d4;
  undefined4 local_7d0;
  undefined4 local_7cc;
  undefined4 local_7c8;
  undefined4 local_7c4;
  float local_7c0;
  float fStack_7bc;
  float fStack_7b8;
  float fStack_7b4;
  undefined1 local_7b0 [16];
  float local_7a0;
  float fStack_79c;
  float fStack_798;
  float fStack_794;
  undefined1 local_790 [16];
  undefined1 local_780 [16];
  undefined1 local_770 [16];
  undefined1 local_760 [16];
  undefined1 local_750 [16];
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float local_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [16];
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined1 local_5d0 [16];
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined1 local_580 [16];
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  undefined1 local_4b0 [8];
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined1 *local_468;
  undefined1 *local_460;
  float *local_458;
  undefined8 *local_450;
  undefined1 *local_448;
  float *local_440;
  undefined8 *local_438;
  undefined8 *local_430;
  float *local_428;
  undefined8 *local_420;
  undefined1 *local_418;
  float *local_410;
  undefined8 *local_408;
  undefined8 *local_400;
  float *local_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  float local_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined4 local_1b8;
  undefined4 local_1b4;
  undefined4 local_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined4 local_198;
  undefined4 local_194;
  undefined4 local_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined4 local_178;
  undefined4 local_174;
  undefined4 local_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined4 local_158;
  undefined4 local_154;
  undefined4 local_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined4 local_138;
  undefined4 local_134;
  undefined4 local_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined4 local_118;
  undefined4 local_114;
  undefined4 local_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_f8;
  undefined4 local_f4;
  undefined4 local_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined4 local_d8;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 uStack_cc;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  undefined4 local_b8;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 local_54;
  
  local_2fd0 = *(int *)((long)in_RDI + 0x2c);
  local_2fd4 = (int)in_RDI[6];
  local_2fd8 = *(int *)((long)in_RDI + 0x34);
  local_2fdc = (int)in_RDI[7];
  local_2fe0 = (int)in_RDI[3];
  local_2fe4 = local_2fd0 * local_2fd4 * local_2fd8 * local_2fe0;
  local_2fc0 = in_RDI;
  for (local_2fe8 = 0; local_2fe8 < local_2fdc; local_2fe8 = local_2fe8 + 1) {
    local_2fa8 = &local_3038;
    local_2e8c = *(int *)((long)local_2fc0 + 0x2c);
    local_2e90 = (int)local_2fc0[6];
    local_2e94 = *(undefined4 *)((long)local_2fc0 + 0x34);
    local_2ea0 = (undefined1 (*) [64])
                 (*local_2fc0 + local_2fc0[8] * (long)local_2fe8 * local_2fc0[2]);
    local_2ea8 = local_2fc0[2];
    local_2eac = (undefined4)local_2fc0[3];
    local_2eb8 = local_2fc0[4];
    local_2e88 = &local_3038;
    local_2e78 = (long)local_2e8c * (long)local_2e90 * local_2ea8;
    local_2fa0 = &local_3038;
    local_2f90 = &local_3038;
    local_2e7c = 0x10;
    local_2fb4 = local_2fe8;
    local_2fb5 = 1;
    local_3038 = 0;
    local_3028 = 0;
    local_3020 = 0;
    local_3010 = 0;
    local_300c = 0;
    local_3008 = 0;
    local_3004 = 0;
    local_3000 = 0;
    local_2ff8 = 0;
    local_3030 = 0;
    local_2ff0 = local_2ea0;
    for (local_303c = 0; uVar72 = uStack_3048._4_4_, uVar71 = uStack_3050._4_4_,
        uVar70 = uStack_3058._4_4_, uVar69 = uStack_3060._4_4_, uVar68 = uStack_3068._4_4_,
        uVar67 = uStack_3070._4_4_, uVar66 = uStack_3078._4_4_, uVar65 = local_3080._4_4_,
        local_303c + 0xf < local_2fe4; local_303c = local_303c + 0x10) {
      local_2f88 = local_2ff0;
      local_2840 = *(undefined8 *)*local_2ff0;
      uStack_2838 = *(undefined8 *)(*local_2ff0 + 8);
      uStack_2830 = *(undefined8 *)(*local_2ff0 + 0x10);
      uStack_2828 = *(undefined8 *)(*local_2ff0 + 0x18);
      uStack_2820 = *(undefined8 *)(*local_2ff0 + 0x20);
      uStack_2818 = *(undefined8 *)(*local_2ff0 + 0x28);
      uStack_2810 = *(undefined8 *)(*local_2ff0 + 0x30);
      uStack_2808 = *(undefined8 *)(*local_2ff0 + 0x38);
      uStack_3078._4_4_ = (uint)((ulong)uStack_2838 >> 0x20);
      uStack_3070._0_4_ = (undefined4)uStack_2830;
      uStack_3070._4_4_ = (uint)((ulong)uStack_2830 >> 0x20);
      uStack_3068._0_4_ = (undefined4)uStack_2828;
      uStack_3068._4_4_ = (uint)((ulong)uStack_2828 >> 0x20);
      uStack_3060._0_4_ = (undefined4)uStack_2820;
      uStack_3060._4_4_ = (uint)((ulong)uStack_2820 >> 0x20);
      uStack_3058._0_4_ = (undefined4)uStack_2818;
      uStack_3058._4_4_ = (uint)((ulong)uStack_2818 >> 0x20);
      uStack_3050._0_4_ = (undefined4)uStack_2810;
      uStack_3050._4_4_ = (uint)((ulong)uStack_2810 >> 0x20);
      uStack_3048._0_4_ = (undefined4)uStack_2808;
      uStack_3048._4_4_ = (uint)((ulong)uStack_2808 >> 0x20);
      local_2e38 = local_2fc9;
      local_2e40 = &local_3080;
      auVar36._12_4_ = uStack_3078._4_4_;
      auVar36._0_12_ = *(undefined1 (*) [12])*local_2ff0;
      auVar36._16_4_ = (undefined4)uStack_3070;
      auVar36._20_4_ = uStack_3070._4_4_;
      auVar36._24_4_ = (undefined4)uStack_3068;
      auVar36._28_4_ = uStack_3068._4_4_;
      auVar36._32_4_ = (undefined4)uStack_3060;
      auVar36._36_4_ = uStack_3060._4_4_;
      auVar36._40_4_ = (undefined4)uStack_3058;
      auVar36._44_4_ = uStack_3058._4_4_;
      auVar36._48_4_ = (undefined4)uStack_3050;
      auVar36._52_4_ = uStack_3050._4_4_;
      auVar36._56_4_ = (undefined4)uStack_3048;
      auVar36._60_4_ = uStack_3048._4_4_;
      auVar35._12_4_ = uStack_3078._4_4_;
      auVar35._0_12_ = *(undefined1 (*) [12])*local_2ff0;
      auVar35._16_4_ = (undefined4)uStack_3070;
      auVar35._20_4_ = uStack_3070._4_4_;
      auVar35._24_4_ = (undefined4)uStack_3068;
      auVar35._28_4_ = uStack_3068._4_4_;
      auVar35._32_4_ = (undefined4)uStack_3060;
      auVar35._36_4_ = uStack_3060._4_4_;
      auVar35._40_4_ = (undefined4)uStack_3058;
      auVar35._44_4_ = uStack_3058._4_4_;
      auVar35._48_4_ = (undefined4)uStack_3050;
      auVar35._52_4_ = uStack_3050._4_4_;
      auVar35._56_4_ = (undefined4)uStack_3048;
      auVar35._60_4_ = uStack_3048._4_4_;
      auVar34._12_4_ = uStack_3078._4_4_;
      auVar34._0_12_ = *(undefined1 (*) [12])*local_2ff0;
      auVar34._16_4_ = (undefined4)uStack_3070;
      auVar34._20_4_ = uStack_3070._4_4_;
      auVar34._24_4_ = (undefined4)uStack_3068;
      auVar34._28_4_ = uStack_3068._4_4_;
      auVar34._32_4_ = (undefined4)uStack_3060;
      auVar34._36_4_ = uStack_3060._4_4_;
      auVar34._40_4_ = (undefined4)uStack_3058;
      auVar34._44_4_ = uStack_3058._4_4_;
      auVar34._48_4_ = (undefined4)uStack_3050;
      auVar34._52_4_ = uStack_3050._4_4_;
      auVar34._56_4_ = (undefined4)uStack_3048;
      auVar34._60_4_ = uStack_3048._4_4_;
      local_1804 = 0x80000000;
      local_1880 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      local_2880 = local_1880._0_8_;
      uStack_2878 = local_1880._8_8_;
      uStack_2870 = local_1880._16_8_;
      uStack_2868 = local_1880._24_8_;
      uStack_2860 = local_1880._32_8_;
      uStack_2858 = local_1880._40_8_;
      uStack_2850 = local_1880._48_8_;
      uStack_2848 = local_1880._56_8_;
      local_1884 = 0;
      local_1900 = vbroadcastss_avx512f(ZEXT416(0));
      local_28c0 = local_1900._0_8_;
      uStack_28b8 = local_1900._8_8_;
      uStack_28b0 = local_1900._16_8_;
      uStack_28a8 = local_1900._24_8_;
      uStack_28a0 = local_1900._32_8_;
      uStack_2898 = local_1900._40_8_;
      uStack_2890 = local_1900._48_8_;
      uStack_2888 = local_1900._56_8_;
      local_1904 = 0x3f000000;
      local_1980 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
      local_2900 = local_1980._0_8_;
      uStack_28f8 = local_1980._8_8_;
      uStack_28f0 = local_1980._16_8_;
      uStack_28e8 = local_1980._24_8_;
      uStack_28e0 = local_1980._32_8_;
      uStack_28d8 = local_1980._40_8_;
      uStack_28d0 = local_1980._48_8_;
      uStack_28c8 = local_1980._56_8_;
      local_1984 = 0x3f800000;
      local_1a00 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      local_2940 = local_1a00._0_8_;
      uStack_2938 = local_1a00._8_8_;
      uStack_2930 = local_1a00._16_8_;
      uStack_2928 = local_1a00._24_8_;
      uStack_2920 = local_1a00._32_8_;
      uStack_2918 = local_1a00._40_8_;
      uStack_2910 = local_1a00._48_8_;
      uStack_2908 = local_1a00._56_8_;
      local_1a04 = 0x3cc48f19;
      local_1a80 = vbroadcastss_avx512f(ZEXT416(0x3cc48f19));
      local_2980 = local_1a80._0_8_;
      uStack_2978 = local_1a80._8_8_;
      uStack_2970 = local_1a80._16_8_;
      uStack_2968 = local_1a80._24_8_;
      uStack_2960 = local_1a80._32_8_;
      uStack_2958 = local_1a80._40_8_;
      uStack_2950 = local_1a80._48_8_;
      uStack_2948 = local_1a80._56_8_;
      local_1a84 = 0x3d2dbdcf;
      local_1b00 = vbroadcastss_avx512f(ZEXT416(0x3d2dbdcf));
      local_29c0 = local_1b00._0_8_;
      uStack_29b8 = local_1b00._8_8_;
      uStack_29b0 = local_1b00._16_8_;
      uStack_29a8 = local_1b00._24_8_;
      uStack_29a0 = local_1b00._32_8_;
      uStack_2998 = local_1b00._40_8_;
      uStack_2990 = local_1b00._48_8_;
      uStack_2988 = local_1b00._56_8_;
      local_1b04 = 0x3d997dcc;
      local_1b80 = vbroadcastss_avx512f(ZEXT416(0x3d997dcc));
      local_2a00 = local_1b80._0_8_;
      uStack_29f8 = local_1b80._8_8_;
      uStack_29f0 = local_1b80._16_8_;
      uStack_29e8 = local_1b80._24_8_;
      uStack_29e0 = local_1b80._32_8_;
      uStack_29d8 = local_1b80._40_8_;
      uStack_29d0 = local_1b80._48_8_;
      uStack_29c8 = local_1b80._56_8_;
      local_1b84 = 0x3d3a73d8;
      local_1c00 = vbroadcastss_avx512f(ZEXT416(0x3d3a73d8));
      local_2a40 = local_1c00._0_8_;
      uStack_2a38 = local_1c00._8_8_;
      uStack_2a30 = local_1c00._16_8_;
      uStack_2a28 = local_1c00._24_8_;
      uStack_2a20 = local_1c00._32_8_;
      uStack_2a18 = local_1c00._40_8_;
      uStack_2a10 = local_1c00._48_8_;
      uStack_2a08 = local_1c00._56_8_;
      local_1c04 = 0x3f800000;
      local_1c80 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      local_2a80 = local_1c80._0_8_;
      uStack_2a78 = local_1c80._8_8_;
      uStack_2a70 = local_1c80._16_8_;
      uStack_2a68 = local_1c80._24_8_;
      uStack_2a60 = local_1c80._32_8_;
      uStack_2a58 = local_1c80._40_8_;
      uStack_2a50 = local_1c80._48_8_;
      uStack_2a48 = local_1c80._56_8_;
      local_1c84 = 0x3e2aaaf8;
      local_1d00 = vbroadcastss_avx512f(ZEXT416(0x3e2aaaf8));
      local_2ac0 = local_1d00._0_8_;
      uStack_2ab8 = local_1d00._8_8_;
      uStack_2ab0 = local_1d00._16_8_;
      uStack_2aa8 = local_1d00._24_8_;
      uStack_2aa0 = local_1d00._32_8_;
      uStack_2a98 = local_1d00._40_8_;
      uStack_2a90 = local_1d00._48_8_;
      uStack_2a88 = local_1d00._56_8_;
      local_1d04 = 0x3fc90fdb;
      local_1d80 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
      local_2b00 = local_1d80._0_8_;
      uStack_2af8 = local_1d80._8_8_;
      uStack_2af0 = local_1d80._16_8_;
      uStack_2ae8 = local_1d80._24_8_;
      uStack_2ae0 = local_1d80._32_8_;
      uStack_2ad8 = local_1d80._40_8_;
      uStack_2ad0 = local_1d80._48_8_;
      uStack_2ac8 = local_1d80._56_8_;
      local_1d84 = 0x40490fdb;
      local_1e00 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
      local_2b40 = local_1e00._0_8_;
      uStack_2b38 = local_1e00._8_8_;
      uStack_2b30 = local_1e00._16_8_;
      uStack_2b28 = local_1e00._24_8_;
      uStack_2b20 = local_1e00._32_8_;
      uStack_2b18 = local_1e00._40_8_;
      uStack_2b10 = local_1e00._48_8_;
      uStack_2b08 = local_1e00._56_8_;
      local_27c0 = local_1880._0_8_;
      uStack_27b8 = local_1880._8_8_;
      uStack_27b0 = local_1880._16_8_;
      uStack_27a8 = local_1880._24_8_;
      uStack_27a0 = local_1880._32_8_;
      uStack_2798 = local_1880._40_8_;
      uStack_2790 = local_1880._48_8_;
      uStack_2788 = local_1880._56_8_;
      auVar75 = vmovdqa64_avx512f(local_1880);
      auVar76 = vmovdqa64_avx512f(auVar34);
      auVar75 = vpandd_avx512f(auVar75,auVar76);
      local_2b80 = vmovdqa64_avx512f(auVar75);
      local_1e40 = local_1880._0_8_;
      uStack_1e38 = local_1880._8_8_;
      uStack_1e30 = local_1880._16_8_;
      uStack_1e28 = local_1880._24_8_;
      uStack_1e20 = local_1880._32_8_;
      uStack_1e18 = local_1880._40_8_;
      uStack_1e10 = local_1880._48_8_;
      uStack_1e08 = local_1880._56_8_;
      auVar75 = vmovdqa64_avx512f(local_1880);
      auVar76 = vmovdqa64_avx512f(auVar35);
      auVar75 = vpandnd_avx512f(auVar75,auVar76);
      local_2bc0 = vmovdqa64_avx512f(auVar75);
      uVar10 = vcmpps_avx512f(local_2bc0,local_1980,2);
      local_2bc2 = (ushort)uVar10;
      local_24c0 = local_1980._0_8_;
      uStack_24b8 = local_1980._8_8_;
      uStack_24b0 = local_1980._16_8_;
      uStack_24a8 = local_1980._24_8_;
      uStack_24a0 = local_1980._32_8_;
      uStack_2498 = local_1980._40_8_;
      uStack_2490 = local_1980._48_8_;
      uStack_2488 = local_1980._56_8_;
      local_26c0 = local_1a00._0_8_;
      uStack_26b8 = local_1a00._8_8_;
      uStack_26b0 = local_1a00._16_8_;
      uStack_26a8 = local_1a00._24_8_;
      uStack_26a0 = local_1a00._32_8_;
      uStack_2698 = local_1a00._40_8_;
      uStack_2690 = local_1a00._48_8_;
      uStack_2688 = local_1a00._56_8_;
      local_2700 = local_2bc0._0_8_;
      uStack_26f8 = local_2bc0._8_8_;
      uStack_26f0 = local_2bc0._16_8_;
      uStack_26e8 = local_2bc0._24_8_;
      uStack_26e0 = local_2bc0._32_8_;
      uStack_26d8 = local_2bc0._40_8_;
      uStack_26d0 = local_2bc0._48_8_;
      uStack_26c8 = local_2bc0._56_8_;
      local_2500 = vsubps_avx512f(local_1a00,local_2bc0);
      local_2480 = vmulps_avx512f(local_1980,local_2500);
      local_2c40 = vsqrtps_avx512f(local_2480);
      local_1680._0_4_ = local_2bc0._0_4_;
      local_1680._4_4_ = local_2bc0._4_4_;
      uStack_1678._0_4_ = local_2bc0._8_4_;
      uStack_1678._4_4_ = local_2bc0._12_4_;
      uStack_1670._0_4_ = local_2bc0._16_4_;
      uStack_1670._4_4_ = local_2bc0._20_4_;
      uStack_1668._0_4_ = local_2bc0._24_4_;
      uStack_1668._4_4_ = local_2bc0._28_4_;
      uStack_1660._0_4_ = local_2bc0._32_4_;
      uStack_1660._4_4_ = local_2bc0._36_4_;
      uStack_1658._0_4_ = local_2bc0._40_4_;
      uStack_1658._4_4_ = local_2bc0._44_4_;
      uStack_1650._0_4_ = local_2bc0._48_4_;
      uStack_1650._4_4_ = local_2bc0._52_4_;
      uStack_1648._0_4_ = local_2bc0._56_4_;
      uStack_1648._4_4_ = local_2bc0._60_4_;
      local_1600._0_4_ = local_2c40._0_4_;
      local_1600._4_4_ = local_2c40._4_4_;
      uStack_15f8._0_4_ = local_2c40._8_4_;
      uStack_15f8._4_4_ = local_2c40._12_4_;
      uStack_15f0._0_4_ = local_2c40._16_4_;
      uStack_15f0._4_4_ = local_2c40._20_4_;
      uStack_15e8._0_4_ = local_2c40._24_4_;
      uStack_15e8._4_4_ = local_2c40._28_4_;
      uStack_15e0._0_4_ = local_2c40._32_4_;
      uStack_15e0._4_4_ = local_2c40._36_4_;
      uStack_15d8._0_4_ = local_2c40._40_4_;
      uStack_15d8._4_4_ = local_2c40._44_4_;
      uStack_15d0._0_4_ = local_2c40._48_4_;
      uStack_15d0._4_4_ = local_2c40._52_4_;
      uStack_15c8._0_4_ = local_2c40._56_4_;
      uStack_15c8._4_4_ = local_2c40._60_4_;
      bVar1 = (bool)((byte)uVar10 & 1);
      local_2c80 = (uint)bVar1 * (int)local_1680 | (uint)!bVar1 * (int)local_1600;
      bVar1 = (bool)((byte)(local_2bc2 >> 1) & 1);
      uStack_2c7c = (uint)bVar1 * local_1680._4_4_ | (uint)!bVar1 * local_1600._4_4_;
      bVar1 = (bool)((byte)(local_2bc2 >> 2) & 1);
      uStack_2c78 = (uint)bVar1 * (int)uStack_1678 | (uint)!bVar1 * (int)uStack_15f8;
      bVar1 = (bool)((byte)(local_2bc2 >> 3) & 1);
      uStack_2c74 = (uint)bVar1 * uStack_1678._4_4_ | (uint)!bVar1 * uStack_15f8._4_4_;
      bVar1 = (bool)((byte)(local_2bc2 >> 4) & 1);
      uStack_2c70 = (uint)bVar1 * (int)uStack_1670 | (uint)!bVar1 * (int)uStack_15f0;
      bVar1 = (bool)((byte)(local_2bc2 >> 5) & 1);
      uStack_2c6c = (uint)bVar1 * uStack_1670._4_4_ | (uint)!bVar1 * uStack_15f0._4_4_;
      bVar1 = (bool)((byte)(local_2bc2 >> 6) & 1);
      uStack_2c68 = (uint)bVar1 * (int)uStack_1668 | (uint)!bVar1 * (int)uStack_15e8;
      bVar1 = (bool)((byte)(local_2bc2 >> 7) & 1);
      uStack_2c64 = (uint)bVar1 * uStack_1668._4_4_ | (uint)!bVar1 * uStack_15e8._4_4_;
      bVar6 = (byte)((ulong)uVar10 >> 8);
      uStack_2c60 = (uint)(bVar6 & 1) * (int)uStack_1660 |
                    (uint)!(bool)(bVar6 & 1) * (int)uStack_15e0;
      bVar1 = (bool)(bVar6 >> 1 & 1);
      uStack_2c5c = (uint)bVar1 * uStack_1660._4_4_ | (uint)!bVar1 * uStack_15e0._4_4_;
      bVar1 = (bool)(bVar6 >> 2 & 1);
      uStack_2c58 = (uint)bVar1 * (int)uStack_1658 | (uint)!bVar1 * (int)uStack_15d8;
      bVar1 = (bool)(bVar6 >> 3 & 1);
      uStack_2c54 = (uint)bVar1 * uStack_1658._4_4_ | (uint)!bVar1 * uStack_15d8._4_4_;
      bVar1 = (bool)(bVar6 >> 4 & 1);
      uStack_2c50 = (uint)bVar1 * (int)uStack_1650 | (uint)!bVar1 * (int)uStack_15d0;
      bVar1 = (bool)(bVar6 >> 5 & 1);
      uStack_2c4c = (uint)bVar1 * uStack_1650._4_4_ | (uint)!bVar1 * uStack_15d0._4_4_;
      bVar1 = (bool)(bVar6 >> 6 & 1);
      uStack_2c48 = (uint)bVar1 * (int)uStack_1648 | (uint)!bVar1 * (int)uStack_15c8;
      uStack_2c44 = (uint)(bVar6 >> 7) * uStack_1648._4_4_ |
                    (uint)!(bool)(bVar6 >> 7) * uStack_15c8._4_4_;
      local_2580 = CONCAT44(uStack_2c7c,local_2c80);
      uStack_2578 = CONCAT44(uStack_2c74,uStack_2c78);
      uStack_2570 = CONCAT44(uStack_2c6c,uStack_2c70);
      uStack_2568 = CONCAT44(uStack_2c64,uStack_2c68);
      uStack_2560 = CONCAT44(uStack_2c5c,uStack_2c60);
      uStack_2558 = CONCAT44(uStack_2c54,uStack_2c58);
      uStack_2550 = CONCAT44(uStack_2c4c,uStack_2c50);
      uStack_2548 = CONCAT44(uStack_2c44,uStack_2c48);
      auVar17._8_8_ = uStack_2578;
      auVar17._0_8_ = local_2580;
      auVar17._16_8_ = uStack_2570;
      auVar17._24_8_ = uStack_2568;
      auVar17._32_8_ = uStack_2560;
      auVar17._40_8_ = uStack_2558;
      auVar17._48_8_ = uStack_2550;
      auVar17._56_8_ = uStack_2548;
      auVar16._8_8_ = uStack_2578;
      auVar16._0_8_ = local_2580;
      auVar16._16_8_ = uStack_2570;
      auVar16._24_8_ = uStack_2568;
      auVar16._32_8_ = uStack_2560;
      auVar16._40_8_ = uStack_2558;
      auVar16._48_8_ = uStack_2550;
      auVar16._56_8_ = uStack_2548;
      local_2cc0 = vmulps_avx512f(auVar17,auVar16);
      local_2600 = local_2cc0._0_8_;
      uStack_25f8 = local_2cc0._8_8_;
      uStack_25f0 = local_2cc0._16_8_;
      uStack_25e8 = local_2cc0._24_8_;
      uStack_25e0 = local_2cc0._32_8_;
      uStack_25d8 = local_2cc0._40_8_;
      uStack_25d0 = local_2cc0._48_8_;
      uStack_25c8 = local_2cc0._56_8_;
      local_2d00 = vmulps_avx512f(local_2cc0,local_2cc0);
      local_23c0 = local_2cc0._0_8_;
      uStack_23b8 = local_2cc0._8_8_;
      uStack_23b0 = local_2cc0._16_8_;
      uStack_23a8 = local_2cc0._24_8_;
      uStack_23a0 = local_2cc0._32_8_;
      uStack_2398 = local_2cc0._40_8_;
      uStack_2390 = local_2cc0._48_8_;
      uStack_2388 = local_2cc0._56_8_;
      local_2180 = local_2d00._0_8_;
      uStack_2178 = local_2d00._8_8_;
      uStack_2170 = local_2d00._16_8_;
      uStack_2168 = local_2d00._24_8_;
      uStack_2160 = local_2d00._32_8_;
      uStack_2158 = local_2d00._40_8_;
      uStack_2150 = local_2d00._48_8_;
      uStack_2148 = local_2d00._56_8_;
      local_2100 = local_1b00._0_8_;
      uStack_20f8 = local_1b00._8_8_;
      uStack_20f0 = local_1b00._16_8_;
      uStack_20e8 = local_1b00._24_8_;
      uStack_20e0 = local_1b00._32_8_;
      uStack_20d8 = local_1b00._40_8_;
      uStack_20d0 = local_1b00._48_8_;
      uStack_20c8 = local_1b00._56_8_;
      local_2140 = local_1c00._0_8_;
      uStack_2138 = local_1c00._8_8_;
      uStack_2130 = local_1c00._16_8_;
      uStack_2128 = local_1c00._24_8_;
      uStack_2120 = local_1c00._32_8_;
      uStack_2118 = local_1c00._40_8_;
      uStack_2110 = local_1c00._48_8_;
      uStack_2108 = local_1c00._56_8_;
      local_21c0 = vfmadd213ps_avx512f(local_1b00,local_2d00,local_1c00);
      local_2200 = local_1d00._0_8_;
      uStack_21f8 = local_1d00._8_8_;
      uStack_21f0 = local_1d00._16_8_;
      uStack_21e8 = local_1d00._24_8_;
      uStack_21e0 = local_1d00._32_8_;
      uStack_21d8 = local_1d00._40_8_;
      uStack_21d0 = local_1d00._48_8_;
      uStack_21c8 = local_1d00._56_8_;
      local_2400 = vfmadd213ps_avx512f(local_21c0,local_2d00,local_1d00);
      local_2300 = local_2d00._0_8_;
      uStack_22f8 = local_2d00._8_8_;
      uStack_22f0 = local_2d00._16_8_;
      uStack_22e8 = local_2d00._24_8_;
      uStack_22e0 = local_2d00._32_8_;
      uStack_22d8 = local_2d00._40_8_;
      uStack_22d0 = local_2d00._48_8_;
      uStack_22c8 = local_2d00._56_8_;
      local_2280 = local_1a80._0_8_;
      uStack_2278 = local_1a80._8_8_;
      uStack_2270 = local_1a80._16_8_;
      uStack_2268 = local_1a80._24_8_;
      uStack_2260 = local_1a80._32_8_;
      uStack_2258 = local_1a80._40_8_;
      uStack_2250 = local_1a80._48_8_;
      uStack_2248 = local_1a80._56_8_;
      local_22c0 = local_1b80._0_8_;
      uStack_22b8 = local_1b80._8_8_;
      uStack_22b0 = local_1b80._16_8_;
      uStack_22a8 = local_1b80._24_8_;
      uStack_22a0 = local_1b80._32_8_;
      uStack_2298 = local_1b80._40_8_;
      uStack_2290 = local_1b80._48_8_;
      uStack_2288 = local_1b80._56_8_;
      local_2340 = vfmadd213ps_avx512f(local_1a80,local_2d00,local_1b80);
      local_2380 = local_1c80._0_8_;
      uStack_2378 = local_1c80._8_8_;
      uStack_2370 = local_1c80._16_8_;
      uStack_2368 = local_1c80._24_8_;
      uStack_2360 = local_1c80._32_8_;
      uStack_2358 = local_1c80._40_8_;
      uStack_2350 = local_1c80._48_8_;
      uStack_2348 = local_1c80._56_8_;
      local_2440 = vfmadd213ps_avx512f(local_2340,local_2d00,local_1c80);
      local_2d40 = vfmadd213ps_avx512f(local_2400,local_2cc0,local_2440);
      local_2640 = local_2d40._0_8_;
      uStack_2638 = local_2d40._8_8_;
      uStack_2630 = local_2d40._16_8_;
      uStack_2628 = local_2d40._24_8_;
      uStack_2620 = local_2d40._32_8_;
      uStack_2618 = local_2d40._40_8_;
      uStack_2610 = local_2d40._48_8_;
      uStack_2608 = local_2d40._56_8_;
      local_2680 = CONCAT44(uStack_2c7c,local_2c80);
      uStack_2678 = CONCAT44(uStack_2c74,uStack_2c78);
      uStack_2670 = CONCAT44(uStack_2c6c,uStack_2c70);
      uStack_2668 = CONCAT44(uStack_2c64,uStack_2c68);
      uStack_2660 = CONCAT44(uStack_2c5c,uStack_2c60);
      uStack_2658 = CONCAT44(uStack_2c54,uStack_2c58);
      uStack_2650 = CONCAT44(uStack_2c4c,uStack_2c50);
      uStack_2648 = CONCAT44(uStack_2c44,uStack_2c48);
      auVar76._8_8_ = uStack_2678;
      auVar76._0_8_ = local_2680;
      auVar76._16_8_ = uStack_2670;
      auVar76._24_8_ = uStack_2668;
      auVar76._32_8_ = uStack_2660;
      auVar76._40_8_ = uStack_2658;
      auVar76._48_8_ = uStack_2650;
      auVar76._56_8_ = uStack_2648;
      local_2d80 = vmulps_avx512f(local_2d40,auVar76);
      local_2740 = local_1d80._0_8_;
      uStack_2738 = local_1d80._8_8_;
      uStack_2730 = local_1d80._16_8_;
      uStack_2728 = local_1d80._24_8_;
      uStack_2720 = local_1d80._32_8_;
      uStack_2718 = local_1d80._40_8_;
      uStack_2710 = local_1d80._48_8_;
      uStack_2708 = local_1d80._56_8_;
      local_1ec0 = local_2d80._0_8_;
      uStack_1eb8 = local_2d80._8_8_;
      uStack_1eb0 = local_2d80._16_8_;
      uStack_1ea8 = local_2d80._24_8_;
      uStack_1ea0 = local_2d80._32_8_;
      uStack_1e98 = local_2d80._40_8_;
      uStack_1e90 = local_2d80._48_8_;
      uStack_1e88 = local_2d80._56_8_;
      local_1f00 = local_2b80._0_8_;
      uStack_1ef8 = local_2b80._8_8_;
      uStack_1ef0 = local_2b80._16_8_;
      uStack_1ee8 = local_2b80._24_8_;
      uStack_1ee0 = local_2b80._32_8_;
      uStack_1ed8 = local_2b80._40_8_;
      uStack_1ed0 = local_2b80._48_8_;
      uStack_1ec8 = local_2b80._56_8_;
      auVar75 = vmovdqa64_avx512f(local_2d80);
      auVar76 = vmovdqa64_avx512f(local_2b80);
      auVar75 = vpord_avx512f(auVar75,auVar76);
      local_2780 = vmovdqa64_avx512f(auVar75);
      local_2dc0 = vsubps_avx512f(local_1d80,local_2780);
      uVar11 = vcmpps_avx512f(auVar36,local_1900,1);
      local_1782 = (ushort)uVar11;
      local_1800._0_4_ = local_1e00._0_4_;
      local_1800._4_4_ = local_1e00._4_4_;
      uStack_17f8._0_4_ = local_1e00._8_4_;
      uStack_17f8._4_4_ = local_1e00._12_4_;
      uStack_17f0._0_4_ = local_1e00._16_4_;
      uStack_17f0._4_4_ = local_1e00._20_4_;
      uStack_17e8._0_4_ = local_1e00._24_4_;
      uStack_17e8._4_4_ = local_1e00._28_4_;
      uStack_17e0._0_4_ = local_1e00._32_4_;
      uStack_17e0._4_4_ = local_1e00._36_4_;
      uStack_17d8._0_4_ = local_1e00._40_4_;
      uStack_17d8._4_4_ = local_1e00._44_4_;
      uStack_17d0._0_4_ = local_1e00._48_4_;
      uStack_17d0._4_4_ = local_1e00._52_4_;
      uStack_17c8._0_4_ = local_1e00._56_4_;
      uStack_17c8._4_4_ = local_1e00._60_4_;
      local_1780 = 0;
      uStack_1778 = 0;
      uStack_1770 = 0;
      uStack_1768 = 0;
      uStack_1760 = 0;
      uStack_1758 = 0;
      uStack_1750 = 0;
      uStack_1748 = 0;
      local_2040 = (uint)((byte)uVar11 & 1) * (int)local_1800;
      iStack_203c = (uint)((byte)(local_1782 >> 1) & 1) * local_1800._4_4_;
      iStack_2038 = (uint)((byte)(local_1782 >> 2) & 1) * (int)uStack_17f8;
      iStack_2034 = (uint)((byte)(local_1782 >> 3) & 1) * uStack_17f8._4_4_;
      iStack_2030 = (uint)((byte)(local_1782 >> 4) & 1) * (int)uStack_17f0;
      iStack_202c = (uint)((byte)(local_1782 >> 5) & 1) * uStack_17f0._4_4_;
      iStack_2028 = (uint)((byte)(local_1782 >> 6) & 1) * (int)uStack_17e8;
      iStack_2024 = (uint)((byte)(local_1782 >> 7) & 1) * uStack_17e8._4_4_;
      bVar7 = (byte)((ulong)uVar11 >> 8);
      iStack_2020 = (uint)(bVar7 & 1) * (int)uStack_17e0;
      iStack_201c = (uint)(bVar7 >> 1 & 1) * uStack_17e0._4_4_;
      iStack_2018 = (uint)(bVar7 >> 2 & 1) * (int)uStack_17d8;
      iStack_2014 = (uint)(bVar7 >> 3 & 1) * uStack_17d8._4_4_;
      iStack_2010 = (uint)(bVar7 >> 4 & 1) * (int)uStack_17d0;
      iStack_200c = (uint)(bVar7 >> 5 & 1) * uStack_17d0._4_4_;
      iStack_2008 = (uint)(bVar7 >> 6 & 1) * (int)uStack_17c8;
      iStack_2004 = (uint)(bVar7 >> 7) * uStack_17c8._4_4_;
      local_2000 = local_2d80._0_8_;
      uStack_1ff8 = local_2d80._8_8_;
      uStack_1ff0 = local_2d80._16_8_;
      uStack_1fe8 = local_2d80._24_8_;
      uStack_1fe0 = local_2d80._32_8_;
      uStack_1fd8 = local_2d80._40_8_;
      uStack_1fd0 = local_2d80._48_8_;
      uStack_1fc8 = local_2d80._56_8_;
      local_1f40 = vaddps_avx512f(local_2d80,local_2d80);
      local_1f80 = local_2b80._0_8_;
      uStack_1f78 = local_2b80._8_8_;
      uStack_1f70 = local_2b80._16_8_;
      uStack_1f68 = local_2b80._24_8_;
      uStack_1f60 = local_2b80._32_8_;
      uStack_1f58 = local_2b80._40_8_;
      uStack_1f50 = local_2b80._48_8_;
      uStack_1f48 = local_2b80._56_8_;
      auVar75 = vmovdqa64_avx512f(local_1f40);
      auVar76 = vmovdqa64_avx512f(local_2b80);
      auVar75 = vpord_avx512f(auVar75,auVar76);
      local_2080 = vmovdqa64_avx512f(auVar75);
      auVar18._4_4_ = iStack_203c;
      auVar18._0_4_ = local_2040;
      auVar18._8_4_ = iStack_2038;
      auVar18._12_4_ = iStack_2034;
      auVar18._16_4_ = iStack_2030;
      auVar18._20_4_ = iStack_202c;
      auVar18._24_4_ = iStack_2028;
      auVar18._28_4_ = iStack_2024;
      auVar18._32_4_ = iStack_2020;
      auVar18._36_4_ = iStack_201c;
      auVar18._40_4_ = iStack_2018;
      auVar18._44_4_ = iStack_2014;
      auVar18._48_4_ = iStack_2010;
      auVar18._52_4_ = iStack_200c;
      auVar18._56_4_ = iStack_2008;
      auVar18._60_4_ = iStack_2004;
      local_2e00 = vaddps_avx512f(auVar18,local_2080);
      local_1740 = local_2dc0._0_8_;
      uStack_1738 = local_2dc0._8_8_;
      uStack_1730 = local_2dc0._16_8_;
      uStack_1728 = local_2dc0._24_8_;
      uStack_1720 = local_2dc0._32_8_;
      uStack_1718 = local_2dc0._40_8_;
      uStack_1710 = local_2dc0._48_8_;
      uStack_1708 = local_2dc0._56_8_;
      local_16c0._0_4_ = local_2e00._0_4_;
      local_16c0._4_4_ = local_2e00._4_4_;
      uStack_16b8._0_4_ = local_2e00._8_4_;
      uStack_16b8._4_4_ = local_2e00._12_4_;
      uStack_16b0._0_4_ = local_2e00._16_4_;
      uStack_16b0._4_4_ = local_2e00._20_4_;
      uStack_16a8._0_4_ = local_2e00._24_4_;
      uStack_16a8._4_4_ = local_2e00._28_4_;
      uStack_16a0._0_4_ = local_2e00._32_4_;
      uStack_16a0._4_4_ = local_2e00._36_4_;
      uStack_1698._0_4_ = local_2e00._40_4_;
      uStack_1698._4_4_ = local_2e00._44_4_;
      uStack_1690._0_4_ = local_2e00._48_4_;
      uStack_1690._4_4_ = local_2e00._52_4_;
      uStack_1688._0_4_ = local_2e00._56_4_;
      uStack_1688._4_4_ = local_2e00._60_4_;
      bVar1 = (bool)((byte)uVar10 & 1);
      bVar2 = (bool)((byte)(local_2bc2 >> 1) & 1);
      local_3080._4_4_ = (uint)bVar2 * local_2dc0._4_4_ | (uint)!bVar2 * local_16c0._4_4_;
      bVar2 = (bool)((byte)(local_2bc2 >> 2) & 1);
      bVar3 = (bool)((byte)(local_2bc2 >> 3) & 1);
      uStack_3078._4_4_ = (uint)bVar3 * local_2dc0._12_4_ | (uint)!bVar3 * uStack_16b8._4_4_;
      bVar3 = (bool)((byte)(local_2bc2 >> 4) & 1);
      bVar4 = (bool)((byte)(local_2bc2 >> 5) & 1);
      uStack_3070._4_4_ = (uint)bVar4 * local_2dc0._20_4_ | (uint)!bVar4 * uStack_16b0._4_4_;
      bVar4 = (bool)((byte)(local_2bc2 >> 6) & 1);
      bVar5 = (bool)((byte)(local_2bc2 >> 7) & 1);
      uStack_3068._4_4_ = (uint)bVar5 * local_2dc0._28_4_ | (uint)!bVar5 * uStack_16a8._4_4_;
      bVar5 = (bool)(bVar6 >> 1 & 1);
      uStack_3060._4_4_ = (uint)bVar5 * local_2dc0._36_4_ | (uint)!bVar5 * uStack_16a0._4_4_;
      bVar5 = (bool)(bVar6 >> 2 & 1);
      bVar8 = (bool)(bVar6 >> 3 & 1);
      uStack_3058._4_4_ = (uint)bVar8 * local_2dc0._44_4_ | (uint)!bVar8 * uStack_1698._4_4_;
      bVar8 = (bool)(bVar6 >> 4 & 1);
      bVar9 = (bool)(bVar6 >> 5 & 1);
      uStack_3050._4_4_ = (uint)bVar9 * local_2dc0._52_4_ | (uint)!bVar9 * uStack_1690._4_4_;
      bVar9 = (bool)(bVar6 >> 6 & 1);
      uStack_3048._4_4_ =
           (uint)(bVar6 >> 7) * local_2dc0._60_4_ | (uint)!(bool)(bVar6 >> 7) * uStack_1688._4_4_;
      local_3080 = CONCAT44(local_3080._4_4_,
                            (uint)bVar1 * local_2dc0._0_4_ | (uint)!bVar1 * (int)local_16c0);
      uStack_3078 = CONCAT44(uStack_3078._4_4_,
                             (uint)bVar2 * local_2dc0._8_4_ | (uint)!bVar2 * (int)uStack_16b8);
      uStack_3070 = CONCAT44(uStack_3070._4_4_,
                             (uint)bVar3 * local_2dc0._16_4_ | (uint)!bVar3 * (int)uStack_16b0);
      uStack_3068 = CONCAT44(uStack_3068._4_4_,
                             (uint)bVar4 * local_2dc0._24_4_ | (uint)!bVar4 * (int)uStack_16a8);
      uStack_3060 = CONCAT44(uStack_3060._4_4_,
                             (uint)(bVar6 & 1) * local_2dc0._32_4_ |
                             (uint)!(bool)(bVar6 & 1) * (int)uStack_16a0);
      uStack_3058 = CONCAT44(uStack_3058._4_4_,
                             (uint)bVar5 * local_2dc0._40_4_ | (uint)!bVar5 * (int)uStack_1698);
      uStack_3050 = CONCAT44(uStack_3050._4_4_,
                             (uint)bVar8 * local_2dc0._48_4_ | (uint)!bVar8 * (int)uStack_1690);
      uStack_3048 = CONCAT44(uStack_3048._4_4_,
                             (uint)bVar9 * local_2dc0._56_4_ | (uint)!bVar9 * (int)uStack_1688);
      local_2f10 = local_2ff0;
      auVar75._8_8_ = uStack_3078;
      auVar75._0_8_ = local_3080;
      auVar75._16_8_ = uStack_3070;
      auVar75._24_8_ = uStack_3068;
      auVar75._32_8_ = uStack_3060;
      auVar75._40_8_ = uStack_3058;
      auVar75._48_8_ = uStack_3050;
      auVar75._56_8_ = uStack_3048;
      *local_2ff0 = auVar75;
      local_2ff0 = local_2ff0 + 1;
      local_2f80 = local_3080;
      uStack_2f78 = uStack_3078;
      uStack_2f70 = uStack_3070;
      uStack_2f68 = uStack_3068;
      uStack_2f60 = uStack_3060;
      uStack_2f58 = uStack_3058;
      uStack_2f50 = uStack_3050;
      uStack_2f48 = uStack_3048;
      local_2800 = local_2840;
      uStack_27f8 = uStack_2838;
      uStack_27f0 = uStack_2830;
      uStack_27e8 = uStack_2828;
      uStack_27e0 = uStack_2820;
      uStack_27d8 = uStack_2818;
      uStack_27d0 = uStack_2810;
      uStack_27c8 = uStack_2808;
      local_25c0 = local_2600;
      uStack_25b8 = uStack_25f8;
      uStack_25b0 = uStack_25f0;
      uStack_25a8 = uStack_25e8;
      uStack_25a0 = uStack_25e0;
      uStack_2598 = uStack_25d8;
      uStack_2590 = uStack_25d0;
      uStack_2588 = uStack_25c8;
      local_2540 = local_2580;
      uStack_2538 = uStack_2578;
      uStack_2530 = uStack_2570;
      uStack_2528 = uStack_2568;
      uStack_2520 = uStack_2560;
      uStack_2518 = uStack_2558;
      uStack_2510 = uStack_2550;
      uStack_2508 = uStack_2548;
      local_2240 = local_2300;
      uStack_2238 = uStack_22f8;
      uStack_2230 = uStack_22f0;
      uStack_2228 = uStack_22e8;
      uStack_2220 = uStack_22e0;
      uStack_2218 = uStack_22d8;
      uStack_2210 = uStack_22d0;
      uStack_2208 = uStack_22c8;
      local_20c0 = local_2180;
      uStack_20b8 = uStack_2178;
      uStack_20b0 = uStack_2170;
      uStack_20a8 = uStack_2168;
      uStack_20a0 = uStack_2160;
      uStack_2098 = uStack_2158;
      uStack_2090 = uStack_2150;
      uStack_2088 = uStack_2148;
      local_1fc0 = local_2000;
      uStack_1fb8 = uStack_1ff8;
      uStack_1fb0 = uStack_1ff0;
      uStack_1fa8 = uStack_1fe8;
      uStack_1fa0 = uStack_1fe0;
      uStack_1f98 = uStack_1fd8;
      uStack_1f90 = uStack_1fd0;
      uStack_1f88 = uStack_1fc8;
      local_1e80 = local_2840;
      uStack_1e78 = uStack_2838;
      uStack_1e70 = uStack_2830;
      uStack_1e68 = uStack_2828;
      uStack_1e60 = uStack_2820;
      uStack_1e58 = uStack_2818;
      uStack_1e50 = uStack_2810;
      uStack_1e48 = uStack_2808;
      local_1800 = local_1e00._0_8_;
      uStack_17f8 = local_1e00._8_8_;
      uStack_17f0 = local_1e00._16_8_;
      uStack_17e8 = local_1e00._24_8_;
      uStack_17e0 = local_1e00._32_8_;
      uStack_17d8 = local_1e00._40_8_;
      uStack_17d0 = local_1e00._48_8_;
      uStack_17c8 = local_1e00._56_8_;
      local_16c2 = local_2bc2;
      local_16c0 = local_2e00._0_8_;
      uStack_16b8 = local_2e00._8_8_;
      uStack_16b0 = local_2e00._16_8_;
      uStack_16a8 = local_2e00._24_8_;
      uStack_16a0 = local_2e00._32_8_;
      uStack_1698 = local_2e00._40_8_;
      uStack_1690 = local_2e00._48_8_;
      uStack_1688 = local_2e00._56_8_;
      local_1680 = local_2bc0._0_8_;
      uStack_1678 = local_2bc0._8_8_;
      uStack_1670 = local_2bc0._16_8_;
      uStack_1668 = local_2bc0._24_8_;
      uStack_1660 = local_2bc0._32_8_;
      uStack_1658 = local_2bc0._40_8_;
      uStack_1650 = local_2bc0._48_8_;
      uStack_1648 = local_2bc0._56_8_;
      local_1602 = local_2bc2;
      local_1600 = local_2c40._0_8_;
      uStack_15f8 = local_2c40._8_8_;
      uStack_15f0 = local_2c40._16_8_;
      uStack_15e8 = local_2c40._24_8_;
      uStack_15e0 = local_2c40._32_8_;
      uStack_15d8 = local_2c40._40_8_;
      uStack_15d0 = local_2c40._48_8_;
      uStack_15c8 = local_2c40._56_8_;
    }
    for (; local_303c + 7 < local_2fe4; local_303c = local_303c + 8) {
      local_2f08 = local_2ff0;
      auVar20 = *(undefined1 (*) [32])*local_2ff0;
      local_2e28 = local_2fc9;
      local_2e30 = local_30a0;
      local_30a0._0_8_ = auVar20._0_8_;
      local_1260 = local_30a0._0_8_;
      local_30a0._8_8_ = auVar20._8_8_;
      uStack_1258 = local_30a0._8_8_;
      local_30a0._16_8_ = auVar20._16_8_;
      uStack_1250 = local_30a0._16_8_;
      local_30a0._24_8_ = auVar20._24_8_;
      uStack_1248 = local_30a0._24_8_;
      local_ac4 = 0x80000000;
      local_aa0 = 0x80000000;
      auVar73 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar73 = vinsertps_avx(auVar73,ZEXT416(0x80000000),0x20);
      local_ac0 = vinsertps_avx(auVar73,ZEXT416(0x80000000),0x30);
      auVar73 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar73 = vinsertps_avx(auVar73,ZEXT416(0x80000000),0x20);
      auStack_ab0 = vinsertps_avx(auVar73,ZEXT416(0x80000000),0x30);
      local_1280 = local_ac0._0_8_;
      uStack_1278 = local_ac0._8_8_;
      uStack_1270 = auStack_ab0._0_8_;
      uStack_1268 = auStack_ab0._8_8_;
      local_ac8 = 0;
      local_a60 = 0;
      auVar73 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar73 = vinsertps_avx(auVar73,ZEXT416(0),0x20);
      local_a80 = vinsertps_avx(auVar73,ZEXT416(0),0x30);
      auVar73 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar73 = vinsertps_avx(auVar73,ZEXT416(0),0x20);
      auStack_a70 = vinsertps_avx(auVar73,ZEXT416(0),0x30);
      local_12a0 = local_a80._0_8_;
      uStack_1298 = local_a80._8_8_;
      uStack_1290 = auStack_a70._0_8_;
      uStack_1288 = auStack_a70._8_8_;
      local_acc = 0x3f000000;
      local_a20 = 0x3f000000;
      auVar73 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
      auVar73 = vinsertps_avx(auVar73,ZEXT416(0x3f000000),0x20);
      local_a40 = vinsertps_avx(auVar73,ZEXT416(0x3f000000),0x30);
      auVar73 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
      auVar73 = vinsertps_avx(auVar73,ZEXT416(0x3f000000),0x20);
      auStack_a30 = vinsertps_avx(auVar73,ZEXT416(0x3f000000),0x30);
      local_12c0 = local_a40._0_8_;
      uStack_12b8 = local_a40._8_8_;
      uStack_12b0 = auStack_a30._0_8_;
      uStack_12a8 = auStack_a30._8_8_;
      local_ad0 = 0x3f800000;
      local_9e0 = 0x3f800000;
      auVar73 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar73 = vinsertps_avx(auVar73,ZEXT416(0x3f800000),0x20);
      local_a00 = vinsertps_avx(auVar73,ZEXT416(0x3f800000),0x30);
      auVar73 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar73 = vinsertps_avx(auVar73,ZEXT416(0x3f800000),0x20);
      auStack_9f0 = vinsertps_avx(auVar73,ZEXT416(0x3f800000),0x30);
      local_12e0 = local_a00._0_8_;
      uStack_12d8 = local_a00._8_8_;
      uStack_12d0 = auStack_9f0._0_8_;
      uStack_12c8 = auStack_9f0._8_8_;
      local_ad4 = 0x3cc48f19;
      local_9a0 = 0x3cc48f19;
      auVar73 = vinsertps_avx(ZEXT416(0x3cc48f19),ZEXT416(0x3cc48f19),0x10);
      auVar73 = vinsertps_avx(auVar73,ZEXT416(0x3cc48f19),0x20);
      local_9c0 = vinsertps_avx(auVar73,ZEXT416(0x3cc48f19),0x30);
      auVar73 = vinsertps_avx(ZEXT416(0x3cc48f19),ZEXT416(0x3cc48f19),0x10);
      auVar73 = vinsertps_avx(auVar73,ZEXT416(0x3cc48f19),0x20);
      auStack_9b0 = vinsertps_avx(auVar73,ZEXT416(0x3cc48f19),0x30);
      local_1300 = local_9c0._0_8_;
      uStack_12f8 = local_9c0._8_8_;
      uStack_12f0 = auStack_9b0._0_8_;
      uStack_12e8 = auStack_9b0._8_8_;
      local_ad8 = 0x3d2dbdcf;
      local_960 = 0x3d2dbdcf;
      auVar73 = vinsertps_avx(ZEXT416(0x3d2dbdcf),ZEXT416(0x3d2dbdcf),0x10);
      auVar73 = vinsertps_avx(auVar73,ZEXT416(0x3d2dbdcf),0x20);
      local_980 = vinsertps_avx(auVar73,ZEXT416(0x3d2dbdcf),0x30);
      auVar73 = vinsertps_avx(ZEXT416(0x3d2dbdcf),ZEXT416(0x3d2dbdcf),0x10);
      auVar73 = vinsertps_avx(auVar73,ZEXT416(0x3d2dbdcf),0x20);
      auStack_970 = vinsertps_avx(auVar73,ZEXT416(0x3d2dbdcf),0x30);
      local_1320 = local_980._0_8_;
      uStack_1318 = local_980._8_8_;
      uStack_1310 = auStack_970._0_8_;
      uStack_1308 = auStack_970._8_8_;
      local_adc = 0x3d997dcc;
      local_920 = 0x3d997dcc;
      auVar73 = vinsertps_avx(ZEXT416(0x3d997dcc),ZEXT416(0x3d997dcc),0x10);
      auVar73 = vinsertps_avx(auVar73,ZEXT416(0x3d997dcc),0x20);
      local_940 = vinsertps_avx(auVar73,ZEXT416(0x3d997dcc),0x30);
      auVar73 = vinsertps_avx(ZEXT416(0x3d997dcc),ZEXT416(0x3d997dcc),0x10);
      auVar73 = vinsertps_avx(auVar73,ZEXT416(0x3d997dcc),0x20);
      auStack_930 = vinsertps_avx(auVar73,ZEXT416(0x3d997dcc),0x30);
      local_1340 = local_940._0_8_;
      uStack_1338 = local_940._8_8_;
      uStack_1330 = auStack_930._0_8_;
      uStack_1328 = auStack_930._8_8_;
      local_ae0 = 0x3d3a73d8;
      local_8e0 = 0x3d3a73d8;
      auVar73 = vinsertps_avx(ZEXT416(0x3d3a73d8),ZEXT416(0x3d3a73d8),0x10);
      auVar73 = vinsertps_avx(auVar73,ZEXT416(0x3d3a73d8),0x20);
      local_900 = vinsertps_avx(auVar73,ZEXT416(0x3d3a73d8),0x30);
      auVar73 = vinsertps_avx(ZEXT416(0x3d3a73d8),ZEXT416(0x3d3a73d8),0x10);
      auVar73 = vinsertps_avx(auVar73,ZEXT416(0x3d3a73d8),0x20);
      auStack_8f0 = vinsertps_avx(auVar73,ZEXT416(0x3d3a73d8),0x30);
      local_1360 = local_900._0_8_;
      uStack_1358 = local_900._8_8_;
      uStack_1350 = auStack_8f0._0_8_;
      uStack_1348 = auStack_8f0._8_8_;
      local_ae4 = 0x3f800000;
      local_8a0 = 0x3f800000;
      auVar73 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar73 = vinsertps_avx(auVar73,ZEXT416(0x3f800000),0x20);
      local_8c0 = vinsertps_avx(auVar73,ZEXT416(0x3f800000),0x30);
      auVar73 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar73 = vinsertps_avx(auVar73,ZEXT416(0x3f800000),0x20);
      auStack_8b0 = vinsertps_avx(auVar73,ZEXT416(0x3f800000),0x30);
      local_1380 = local_8c0._0_8_;
      uStack_1378 = local_8c0._8_8_;
      uStack_1370 = auStack_8b0._0_8_;
      uStack_1368 = auStack_8b0._8_8_;
      local_ae8 = 0x3e2aaaf8;
      local_860 = 0x3e2aaaf8;
      auVar73 = vinsertps_avx(ZEXT416(0x3e2aaaf8),ZEXT416(0x3e2aaaf8),0x10);
      auVar73 = vinsertps_avx(auVar73,ZEXT416(0x3e2aaaf8),0x20);
      local_880 = vinsertps_avx(auVar73,ZEXT416(0x3e2aaaf8),0x30);
      auVar73 = vinsertps_avx(ZEXT416(0x3e2aaaf8),ZEXT416(0x3e2aaaf8),0x10);
      auVar73 = vinsertps_avx(auVar73,ZEXT416(0x3e2aaaf8),0x20);
      auStack_870 = vinsertps_avx(auVar73,ZEXT416(0x3e2aaaf8),0x30);
      local_13a0 = local_880._0_8_;
      uStack_1398 = local_880._8_8_;
      uStack_1390 = auStack_870._0_8_;
      uStack_1388 = auStack_870._8_8_;
      local_aec = 0x3fc90fdb;
      local_820 = 0x3fc90fdb;
      auVar73 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar73 = vinsertps_avx(auVar73,ZEXT416(0x3fc90fdb),0x20);
      local_840 = vinsertps_avx(auVar73,ZEXT416(0x3fc90fdb),0x30);
      auVar73 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar73 = vinsertps_avx(auVar73,ZEXT416(0x3fc90fdb),0x20);
      auStack_830 = vinsertps_avx(auVar73,ZEXT416(0x3fc90fdb),0x30);
      local_13c0 = local_840._0_8_;
      uStack_13b8 = local_840._8_8_;
      uStack_13b0 = auStack_830._0_8_;
      uStack_13a8 = auStack_830._8_8_;
      local_af0 = 0x40490fdb;
      local_7e0 = 0x40490fdb;
      auVar73 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar73 = vinsertps_avx(auVar73,ZEXT416(0x40490fdb),0x20);
      local_800 = vinsertps_avx(auVar73,ZEXT416(0x40490fdb),0x30);
      auVar73 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar73 = vinsertps_avx(auVar73,ZEXT416(0x40490fdb),0x20);
      auStack_7f0 = vinsertps_avx(auVar73,ZEXT416(0x40490fdb),0x30);
      local_13e0 = local_800._0_8_;
      uStack_13d8 = local_800._8_8_;
      uStack_13d0 = auStack_7f0._0_8_;
      uStack_13c8 = auStack_7f0._8_8_;
      local_1160 = local_ac0._0_8_;
      uStack_1158 = local_ac0._8_8_;
      uStack_1150 = auStack_ab0._0_8_;
      uStack_1148 = auStack_ab0._8_8_;
      auVar21._16_8_ = auStack_ab0._0_8_;
      auVar21._0_16_ = local_ac0;
      auVar21._24_8_ = auStack_ab0._8_8_;
      local_1400 = vpand_avx2(auVar21,auVar20);
      local_b20 = local_ac0._0_8_;
      uStack_b18 = local_ac0._8_8_;
      uStack_b10 = auStack_ab0._0_8_;
      uStack_b08 = auStack_ab0._8_8_;
      auVar28._16_8_ = auStack_ab0._0_8_;
      auVar28._0_16_ = local_ac0;
      auVar28._24_8_ = auStack_ab0._8_8_;
      local_1420 = vpandn_avx2(auVar28,auVar20);
      auVar74._16_8_ = auStack_a30._0_8_;
      auVar74._0_16_ = local_a40;
      auVar74._24_8_ = auStack_a30._8_8_;
      local_1440 = vcmpps_avx(local_1420,auVar74,2);
      local_10e0 = local_a00._0_8_;
      uStack_10d8 = local_a00._8_8_;
      uStack_10d0 = auStack_9f0._0_8_;
      uStack_10c8 = auStack_9f0._8_8_;
      local_1100 = local_1420._0_8_;
      uStack_10f8 = local_1420._8_8_;
      uStack_10f0 = local_1420._16_8_;
      uStack_10e8 = local_1420._24_8_;
      auVar23._16_8_ = auStack_9f0._0_8_;
      auVar23._0_16_ = local_a00;
      auVar23._24_8_ = auStack_9f0._8_8_;
      _local_1000 = vsubps_avx(auVar23,local_1420);
      local_fe0._0_4_ = local_a40._0_4_;
      local_fe0._4_4_ = local_a40._4_4_;
      uStack_fd8._0_4_ = local_a40._8_4_;
      uStack_fd8._4_4_ = local_a40._12_4_;
      uStack_fd0._0_4_ = auStack_a30._0_4_;
      uStack_fd0._4_4_ = auStack_a30._4_4_;
      uStack_fc8._0_4_ = auStack_a30._8_4_;
      uStack_fc8._4_4_ = auStack_a30._12_4_;
      uStack_fa4 = uStack_fc8._4_4_;
      local_fc0 = (float)local_fe0 * (float)local_1000._0_4_;
      fStack_fbc = local_fe0._4_4_ * (float)local_1000._4_4_;
      fStack_fb8 = (float)uStack_fd8 * fStack_ff8;
      fStack_fb4 = uStack_fd8._4_4_ * fStack_ff4;
      fStack_fb0 = (float)uStack_fd0 * fStack_ff0;
      fStack_fac = uStack_fd0._4_4_ * fStack_fec;
      fStack_fa8 = (float)uStack_fc8 * fStack_fe8;
      auVar24._4_4_ = fStack_fbc;
      auVar24._0_4_ = local_fc0;
      auVar24._8_4_ = fStack_fb8;
      auVar24._12_4_ = fStack_fb4;
      auVar24._16_4_ = fStack_fb0;
      auVar24._20_4_ = fStack_fac;
      auVar24._24_4_ = fStack_fa8;
      auVar24._28_4_ = uStack_fc8._4_4_;
      local_1460 = vsqrtps_avx(auVar24);
      local_11a0 = local_1440._0_8_;
      uStack_1198 = local_1440._8_8_;
      uStack_1190 = local_1440._16_8_;
      uStack_1188 = local_1440._24_8_;
      local_11c0 = local_1420._0_8_;
      uStack_11b8 = local_1420._8_8_;
      uStack_11b0 = local_1420._16_8_;
      uStack_11a8 = local_1420._24_8_;
      local_be0 = vpand_avx2(local_1440,local_1420);
      local_b60 = local_1440._0_8_;
      uStack_b58 = local_1440._8_8_;
      uStack_b50 = local_1440._16_8_;
      uStack_b48 = local_1440._24_8_;
      local_b80 = local_1460._0_8_;
      uStack_b78 = local_1460._8_8_;
      uStack_b70 = local_1460._16_8_;
      uStack_b68 = local_1460._24_8_;
      local_c00 = vpandn_avx2(local_1440,local_1460);
      local_1480 = vpor_avx2(local_be0,local_c00);
      local_1040 = local_1480._0_8_;
      uStack_1038 = local_1480._8_8_;
      uStack_1030 = local_1480._16_8_;
      uStack_1028 = local_1480._24_8_;
      local_1020._0_4_ = local_1480._0_4_;
      local_1020._4_4_ = local_1480._4_4_;
      uStack_1018._0_4_ = local_1480._8_4_;
      uStack_1018._4_4_ = local_1480._12_4_;
      uStack_1010._0_4_ = local_1480._16_4_;
      uStack_1010._4_4_ = local_1480._20_4_;
      uStack_1008._0_4_ = local_1480._24_4_;
      uStack_1008._4_4_ = local_1480._28_4_;
      uStack_1484 = uStack_1008._4_4_;
      local_14a0 = (float)local_1020 * (float)local_1020;
      fStack_149c = local_1020._4_4_ * local_1020._4_4_;
      fStack_1498 = (float)uStack_1018 * (float)uStack_1018;
      fStack_1494 = uStack_1018._4_4_ * uStack_1018._4_4_;
      fStack_1490 = (float)uStack_1010 * (float)uStack_1010;
      fStack_148c = uStack_1010._4_4_ * uStack_1010._4_4_;
      fStack_1488 = (float)uStack_1008 * (float)uStack_1008;
      local_1080 = CONCAT44(fStack_149c,local_14a0);
      uStack_1078 = CONCAT44(fStack_1494,fStack_1498);
      uStack_1070 = CONCAT44(fStack_148c,fStack_1490);
      uStack_1068 = CONCAT44(uStack_1008._4_4_,fStack_1488);
      uStack_14a4 = uStack_1008._4_4_;
      local_14c0 = local_14a0 * local_14a0;
      fStack_14bc = fStack_149c * fStack_149c;
      fStack_14b8 = fStack_1498 * fStack_1498;
      fStack_14b4 = fStack_1494 * fStack_1494;
      fStack_14b0 = fStack_1490 * fStack_1490;
      fStack_14ac = fStack_148c * fStack_148c;
      fStack_14a8 = fStack_1488 * fStack_1488;
      local_f70 = &local_14c0;
      local_f30 = &local_1320;
      local_f38 = &local_1360;
      local_e60 = CONCAT44(fStack_14bc,local_14c0);
      uStack_e58 = CONCAT44(fStack_14b4,fStack_14b8);
      uStack_e50 = CONCAT44(fStack_14ac,fStack_14b0);
      uStack_e48 = CONCAT44(uStack_1008._4_4_,fStack_14a8);
      auVar37._4_4_ = fStack_14bc;
      auVar37._0_4_ = local_14c0;
      auVar37._8_4_ = fStack_14b8;
      auVar37._12_4_ = fStack_14b4;
      auVar37._16_4_ = fStack_14b0;
      auVar37._20_4_ = fStack_14ac;
      auVar37._24_4_ = fStack_14a8;
      auVar37._28_4_ = uStack_1008._4_4_;
      local_e80 = local_980._0_8_;
      uStack_e78 = local_980._8_8_;
      uStack_e70 = auStack_970._0_8_;
      uStack_e68 = auStack_970._8_8_;
      auVar46._16_8_ = auStack_970._0_8_;
      auVar46._0_16_ = local_980;
      auVar46._24_8_ = auStack_970._8_8_;
      local_ea0 = local_900._0_8_;
      uStack_e98 = local_900._8_8_;
      uStack_e90 = auStack_8f0._0_8_;
      uStack_e88 = auStack_8f0._8_8_;
      auVar44._16_8_ = auStack_8f0._0_8_;
      auVar44._0_16_ = local_900;
      auVar44._24_8_ = auStack_8f0._8_8_;
      auVar73 = vfmadd213ps_fma(auVar46,auVar37,auVar44);
      local_f48 = local_1520;
      local_f50 = &local_13a0;
      local_e00 = CONCAT44(fStack_14bc,local_14c0);
      uStack_df8 = CONCAT44(fStack_14b4,fStack_14b8);
      uStack_df0 = CONCAT44(fStack_14ac,fStack_14b0);
      uStack_de8 = CONCAT44(uStack_1008._4_4_,fStack_14a8);
      auVar38._4_4_ = fStack_14bc;
      auVar38._0_4_ = local_14c0;
      auVar38._8_4_ = fStack_14b8;
      auVar38._12_4_ = fStack_14b4;
      auVar38._16_4_ = fStack_14b0;
      auVar38._20_4_ = fStack_14ac;
      auVar38._24_4_ = fStack_14a8;
      auVar38._28_4_ = uStack_1008._4_4_;
      local_1520._0_8_ = auVar73._0_8_;
      local_e20 = local_1520._0_8_;
      local_1520._8_8_ = auVar73._8_8_;
      uStack_e18 = local_1520._8_8_;
      uStack_e10 = 0;
      uStack_e08 = 0;
      local_e40 = local_880._0_8_;
      uStack_e38 = local_880._8_8_;
      uStack_e30 = auStack_870._0_8_;
      uStack_e28 = auStack_870._8_8_;
      auVar42._16_8_ = auStack_870._0_8_;
      auVar42._0_16_ = local_880;
      auVar42._24_8_ = auStack_870._8_8_;
      auVar12 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar38,auVar42);
      local_f60 = &local_1300;
      local_f68 = &local_1340;
      local_da0 = CONCAT44(fStack_14bc,local_14c0);
      uStack_d98 = CONCAT44(fStack_14b4,fStack_14b8);
      uStack_d90 = CONCAT44(fStack_14ac,fStack_14b0);
      uStack_d88 = CONCAT44(uStack_1008._4_4_,fStack_14a8);
      auVar39._4_4_ = fStack_14bc;
      auVar39._0_4_ = local_14c0;
      auVar39._8_4_ = fStack_14b8;
      auVar39._12_4_ = fStack_14b4;
      auVar39._16_4_ = fStack_14b0;
      auVar39._20_4_ = fStack_14ac;
      auVar39._24_4_ = fStack_14a8;
      auVar39._28_4_ = uStack_1008._4_4_;
      local_dc0 = local_9c0._0_8_;
      uStack_db8 = local_9c0._8_8_;
      uStack_db0 = auStack_9b0._0_8_;
      uStack_da8 = auStack_9b0._8_8_;
      auVar47._16_8_ = auStack_9b0._0_8_;
      auVar47._0_16_ = local_9c0;
      auVar47._24_8_ = auStack_9b0._8_8_;
      local_de0 = local_940._0_8_;
      uStack_dd8 = local_940._8_8_;
      uStack_dd0 = auStack_930._0_8_;
      uStack_dc8 = auStack_930._8_8_;
      auVar45._16_8_ = auStack_930._0_8_;
      auVar45._0_16_ = local_940;
      auVar45._24_8_ = auStack_930._8_8_;
      auVar13 = vfmadd213ps_fma(auVar47,auVar39,auVar45);
      local_f78 = local_1560;
      local_f80 = &local_1380;
      local_d40 = CONCAT44(fStack_14bc,local_14c0);
      uStack_d38 = CONCAT44(fStack_14b4,fStack_14b8);
      uStack_d30 = CONCAT44(fStack_14ac,fStack_14b0);
      uStack_d28 = CONCAT44(uStack_1008._4_4_,fStack_14a8);
      auVar40._4_4_ = fStack_14bc;
      auVar40._0_4_ = local_14c0;
      auVar40._8_4_ = fStack_14b8;
      auVar40._12_4_ = fStack_14b4;
      auVar40._16_4_ = fStack_14b0;
      auVar40._20_4_ = fStack_14ac;
      auVar40._24_4_ = fStack_14a8;
      auVar40._28_4_ = uStack_1008._4_4_;
      local_1560._0_8_ = auVar13._0_8_;
      local_d60 = local_1560._0_8_;
      local_1560._8_8_ = auVar13._8_8_;
      uStack_d58 = local_1560._8_8_;
      uStack_d50 = 0;
      uStack_d48 = 0;
      local_d80 = local_8c0._0_8_;
      uStack_d78 = local_8c0._8_8_;
      uStack_d70 = auStack_8b0._0_8_;
      uStack_d68 = auStack_8b0._8_8_;
      auVar43._16_8_ = auStack_8b0._0_8_;
      auVar43._0_16_ = local_8c0;
      auVar43._24_8_ = auStack_8b0._8_8_;
      auVar14 = vfmadd213ps_fma(ZEXT1632(auVar13),auVar40,auVar43);
      local_f88 = &local_14a0;
      local_f90 = local_1500;
      local_f98 = local_1540;
      local_ce0 = CONCAT44(fStack_149c,local_14a0);
      uStack_cd8 = CONCAT44(fStack_1494,fStack_1498);
      uStack_cd0 = CONCAT44(fStack_148c,fStack_1490);
      uStack_cc8 = CONCAT44(uStack_1008._4_4_,fStack_1488);
      auVar41._4_4_ = fStack_149c;
      auVar41._0_4_ = local_14a0;
      auVar41._8_4_ = fStack_1498;
      auVar41._12_4_ = fStack_1494;
      auVar41._16_4_ = fStack_1490;
      auVar41._20_4_ = fStack_148c;
      auVar41._24_4_ = fStack_1488;
      auVar41._28_4_ = uStack_1008._4_4_;
      local_1500._0_8_ = auVar12._0_8_;
      local_d00 = local_1500._0_8_;
      local_1500._8_8_ = auVar12._8_8_;
      uStack_cf8 = local_1500._8_8_;
      uStack_cf0 = 0;
      uStack_ce8 = 0;
      local_1540._0_8_ = auVar14._0_8_;
      local_d20 = local_1540._0_8_;
      local_1540._8_8_ = auVar14._8_8_;
      uStack_d18 = local_1540._8_8_;
      uStack_d10 = 0;
      uStack_d08 = 0;
      auVar15 = vfmadd213ps_fma(ZEXT1632(auVar12),auVar41,ZEXT1632(auVar14));
      local_14e0._0_8_ = auVar15._0_8_;
      uVar10 = local_14e0._0_8_;
      local_14e0._8_8_ = auVar15._8_8_;
      uVar11 = local_14e0._8_8_;
      uStack_1090 = 0;
      uStack_1088 = 0;
      local_10c0 = local_1480._0_8_;
      uStack_10b8 = local_1480._8_8_;
      uStack_10b0 = local_1480._16_8_;
      uStack_10a8 = local_1480._24_8_;
      local_10a0._0_4_ = auVar15._0_4_;
      local_10a0._4_4_ = auVar15._4_4_;
      uStack_1098._0_4_ = auVar15._8_4_;
      uStack_1098._4_4_ = auVar15._12_4_;
      uStack_1564 = 0;
      local_1580 = (float)local_10a0 * (float)local_1020;
      fStack_157c = local_10a0._4_4_ * local_1020._4_4_;
      fStack_1578 = (float)uStack_1098 * (float)uStack_1018;
      fStack_1574 = uStack_1098._4_4_ * uStack_1018._4_4_;
      fStack_1570 = (float)uStack_1010 * 0.0;
      fStack_156c = uStack_1010._4_4_ * 0.0;
      fStack_1568 = (float)uStack_1008 * 0.0;
      local_1120 = local_840._0_8_;
      uStack_1118 = local_840._8_8_;
      uStack_1110 = auStack_830._0_8_;
      uStack_1108 = auStack_830._8_8_;
      local_c20 = CONCAT44(fStack_157c,local_1580);
      uStack_c18 = CONCAT44(fStack_1574,fStack_1578);
      uStack_c10 = CONCAT44(fStack_156c,fStack_1570);
      uStack_c08 = (ulong)(uint)fStack_1568;
      local_c40 = local_1400._0_8_;
      uStack_c38 = local_1400._8_8_;
      uStack_c30 = local_1400._16_8_;
      uStack_c28 = local_1400._24_8_;
      auVar26._8_8_ = uStack_c18;
      auVar26._0_8_ = local_c20;
      auVar26._16_8_ = uStack_c10;
      auVar26._24_4_ = fStack_1568;
      auVar26._28_4_ = 0;
      local_1140 = vpor_avx2(auVar26,local_1400);
      auVar22._16_8_ = auStack_830._0_8_;
      auVar22._0_16_ = local_840;
      auVar22._24_8_ = auStack_830._8_8_;
      local_15a0 = vsubps_avx(auVar22,local_1140);
      auVar19._16_8_ = auStack_a70._0_8_;
      auVar19._0_16_ = local_a80;
      auVar19._24_8_ = auStack_a70._8_8_;
      local_11e0 = vcmpps_avx(auVar20,auVar19,1);
      local_1200 = local_800._0_8_;
      uStack_11f8 = local_800._8_8_;
      uStack_11f0 = auStack_7f0._0_8_;
      uStack_11e8 = auStack_7f0._8_8_;
      auVar20._16_8_ = auStack_7f0._0_8_;
      auVar20._0_16_ = local_800;
      auVar20._24_8_ = auStack_7f0._8_8_;
      _local_f00 = vpand_avx2(local_11e0,auVar20);
      local_ee0 = CONCAT44(fStack_157c,local_1580);
      uStack_ed8 = CONCAT44(fStack_1574,fStack_1578);
      uStack_ed0 = CONCAT44(fStack_156c,fStack_1570);
      uStack_ec8 = (ulong)(uint)fStack_1568;
      local_c60 = local_1580 + local_1580;
      fStack_c5c = fStack_157c + fStack_157c;
      fStack_c58 = fStack_1578 + fStack_1578;
      fStack_c54 = fStack_1574 + fStack_1574;
      fStack_c50 = fStack_1570 + fStack_1570;
      fStack_c4c = fStack_156c + fStack_156c;
      fStack_c48 = fStack_1568 + fStack_1568;
      uStack_c44 = 0;
      local_c80 = local_1400._0_8_;
      uStack_c78 = local_1400._8_8_;
      uStack_c70 = local_1400._16_8_;
      uStack_c68 = local_1400._24_8_;
      auVar25._4_4_ = fStack_c5c;
      auVar25._0_4_ = local_c60;
      auVar25._8_4_ = fStack_c58;
      auVar25._12_4_ = fStack_c54;
      auVar25._16_4_ = fStack_c50;
      auVar25._20_4_ = fStack_c4c;
      auVar25._24_4_ = fStack_c48;
      auVar25._28_4_ = 0;
      _local_f20 = vpor_avx2(auVar25,local_1400);
      local_15c0 = (float)local_f00._0_4_ + (float)local_f20._0_4_;
      fStack_15bc = (float)local_f00._4_4_ + (float)local_f20._4_4_;
      fStack_15b8 = fStack_ef8 + fStack_f18;
      fStack_15b4 = fStack_ef4 + fStack_f14;
      fStack_15b0 = fStack_ef0 + fStack_f10;
      fStack_15ac = fStack_eec + fStack_f0c;
      fStack_15a8 = fStack_ee8 + fStack_f08;
      fStack_15a4 = fStack_ee4 + fStack_f04;
      local_1220 = local_1440._0_8_;
      uStack_1218 = local_1440._8_8_;
      uStack_1210 = local_1440._16_8_;
      uStack_1208 = local_1440._24_8_;
      local_1240 = local_15a0._0_8_;
      uStack_1238 = local_15a0._8_8_;
      uStack_1230 = local_15a0._16_8_;
      uStack_1228 = local_15a0._24_8_;
      local_ca0 = vpand_avx2(local_1440,local_15a0);
      local_ba0 = local_1440._0_8_;
      uStack_b98 = local_1440._8_8_;
      uStack_b90 = local_1440._16_8_;
      uStack_b88 = local_1440._24_8_;
      local_bc0 = CONCAT44(fStack_15bc,local_15c0);
      uStack_bb8 = CONCAT44(fStack_15b4,fStack_15b8);
      uStack_bb0 = CONCAT44(fStack_15ac,fStack_15b0);
      uStack_ba8 = CONCAT44(fStack_15a4,fStack_15a8);
      auVar74 = vpternlogq_avx512vl(local_1440,local_1440,local_1440,0xf);
      auVar27._8_8_ = uStack_bb8;
      auVar27._0_8_ = local_bc0;
      auVar27._16_8_ = uStack_bb0;
      auVar27._24_8_ = uStack_ba8;
      local_cc0 = vpand_avx2(auVar74,auVar27);
      local_30a0 = vpor_avx2(local_ca0,local_cc0);
      local_2ee0 = local_2ff0;
      local_2f00 = local_30a0._0_8_;
      uStack_2ef8 = local_30a0._8_8_;
      uStack_2ef0 = local_30a0._16_8_;
      uStack_2ee8 = local_30a0._24_8_;
      *(undefined1 (*) [32])*local_2ff0 = local_30a0;
      local_2ff0 = (undefined1 (*) [64])(*local_2ff0 + 0x20);
      local_1560 = ZEXT1632(auVar13);
      local_1540 = ZEXT1632(auVar14);
      local_1520 = ZEXT1632(auVar73);
      local_1500 = ZEXT1632(auVar12);
      local_14e0 = ZEXT1632(auVar15);
      local_1180 = local_1260;
      uStack_1178 = uStack_1258;
      uStack_1170 = uStack_1250;
      uStack_1168 = uStack_1248;
      local_10a0 = uVar10;
      uStack_1098 = uVar11;
      local_1060 = local_1080;
      uStack_1058 = uStack_1078;
      uStack_1050 = uStack_1070;
      uStack_1048 = uStack_1068;
      local_1020 = local_1040;
      uStack_1018 = uStack_1038;
      uStack_1010 = uStack_1030;
      uStack_1008 = uStack_1028;
      local_fe0 = local_a40._0_8_;
      uStack_fd8 = local_a40._8_8_;
      uStack_fd0 = auStack_a30._0_8_;
      uStack_fc8 = auStack_a30._8_8_;
      local_f58 = local_f70;
      local_f40 = local_f70;
      local_f28 = local_f70;
      local_ec0 = local_ee0;
      uStack_eb8 = uStack_ed8;
      uStack_eb0 = uStack_ed0;
      uStack_ea8 = uStack_ec8;
      local_b40 = local_1260;
      uStack_b38 = uStack_1258;
      uStack_b30 = uStack_1250;
      uStack_b28 = uStack_1248;
      local_a9c = local_aa0;
      local_a98 = local_aa0;
      local_a94 = local_aa0;
      local_a90 = local_aa0;
      local_a8c = local_aa0;
      local_a88 = local_aa0;
      local_a84 = local_aa0;
      local_a5c = local_a60;
      local_a58 = local_a60;
      local_a54 = local_a60;
      local_a50 = local_a60;
      local_a4c = local_a60;
      local_a48 = local_a60;
      local_a44 = local_a60;
      local_a1c = local_a20;
      local_a18 = local_a20;
      local_a14 = local_a20;
      local_a10 = local_a20;
      local_a0c = local_a20;
      local_a08 = local_a20;
      local_a04 = local_a20;
      local_9dc = local_9e0;
      local_9d8 = local_9e0;
      local_9d4 = local_9e0;
      local_9d0 = local_9e0;
      local_9cc = local_9e0;
      local_9c8 = local_9e0;
      local_9c4 = local_9e0;
      local_99c = local_9a0;
      local_998 = local_9a0;
      local_994 = local_9a0;
      local_990 = local_9a0;
      local_98c = local_9a0;
      local_988 = local_9a0;
      local_984 = local_9a0;
      local_95c = local_960;
      local_958 = local_960;
      local_954 = local_960;
      local_950 = local_960;
      local_94c = local_960;
      local_948 = local_960;
      local_944 = local_960;
      local_91c = local_920;
      local_918 = local_920;
      local_914 = local_920;
      local_910 = local_920;
      local_90c = local_920;
      local_908 = local_920;
      local_904 = local_920;
      local_8dc = local_8e0;
      local_8d8 = local_8e0;
      local_8d4 = local_8e0;
      local_8d0 = local_8e0;
      local_8cc = local_8e0;
      local_8c8 = local_8e0;
      local_8c4 = local_8e0;
      local_89c = local_8a0;
      local_898 = local_8a0;
      local_894 = local_8a0;
      local_890 = local_8a0;
      local_88c = local_8a0;
      local_888 = local_8a0;
      local_884 = local_8a0;
      local_85c = local_860;
      local_858 = local_860;
      local_854 = local_860;
      local_850 = local_860;
      local_84c = local_860;
      local_848 = local_860;
      local_844 = local_860;
      local_81c = local_820;
      local_818 = local_820;
      local_814 = local_820;
      local_810 = local_820;
      local_80c = local_820;
      local_808 = local_820;
      local_804 = local_820;
      local_7dc = local_7e0;
      local_7d8 = local_7e0;
      local_7d4 = local_7e0;
      local_7d0 = local_7e0;
      local_7cc = local_7e0;
      local_7c8 = local_7e0;
      local_7c4 = local_7e0;
    }
    for (; uVar10 = local_3080, uVar11 = uStack_3078, uVar59 = uStack_3070, uVar60 = uStack_3068,
        uVar61 = uStack_3060, uVar62 = uStack_3058, uVar63 = uStack_3050, uVar64 = uStack_3048,
        local_2e68 = local_2f90, local_3018 = local_2eb8, local_303c + 3 < local_2fe4;
        local_303c = local_303c + 4) {
      local_2ed8 = local_2ff0;
      auVar73 = *(undefined1 (*) [16])*local_2ff0;
      local_2e18 = local_2fc9;
      local_2e20 = local_30b0;
      local_30b0._0_8_ = auVar73._0_8_;
      local_610 = local_30b0._0_8_;
      local_30b0._8_8_ = auVar73._8_8_;
      uStack_608 = local_30b0._8_8_;
      local_74 = 0x80000000;
      local_54 = 0x80000000;
      local_70 = 0x80000000;
      local_620 = 0x8000000080000000;
      uStack_618 = 0x8000000080000000;
      local_94 = 0;
      local_78 = 0;
      local_90 = 0;
      local_630 = 0;
      uStack_628 = 0;
      local_b4 = 0x3f000000;
      local_98 = 0x3f000000;
      local_b0 = 0x3f000000;
      local_640 = 0x3f0000003f000000;
      uStack_638 = 0x3f0000003f000000;
      local_d4 = 0x3f800000;
      local_b8 = 0x3f800000;
      local_d0 = 0x3f800000;
      local_650 = 0x3f8000003f800000;
      uStack_648 = 0x3f8000003f800000;
      local_f4 = 0x3cc48f19;
      local_d8 = 0x3cc48f19;
      local_f0 = 0x3cc48f19;
      local_660 = 0x3cc48f193cc48f19;
      uStack_658 = 0x3cc48f193cc48f19;
      local_114 = 0x3d2dbdcf;
      local_f8 = 0x3d2dbdcf;
      local_110 = 0x3d2dbdcf;
      local_670 = 0x3d2dbdcf3d2dbdcf;
      uStack_668 = 0x3d2dbdcf3d2dbdcf;
      local_134 = 0x3d997dcc;
      local_118 = 0x3d997dcc;
      local_130 = 0x3d997dcc;
      local_680 = 0x3d997dcc3d997dcc;
      uStack_678 = 0x3d997dcc3d997dcc;
      local_154 = 0x3d3a73d8;
      local_138 = 0x3d3a73d8;
      local_150 = 0x3d3a73d8;
      local_690 = 0x3d3a73d83d3a73d8;
      uStack_688 = 0x3d3a73d83d3a73d8;
      local_174 = 0x3f800000;
      local_158 = 0x3f800000;
      local_170 = 0x3f800000;
      local_6a0 = 0x3f8000003f800000;
      uStack_698 = 0x3f8000003f800000;
      local_194 = 0x3e2aaaf8;
      local_178 = 0x3e2aaaf8;
      local_190 = 0x3e2aaaf8;
      local_6b0 = 0x3e2aaaf83e2aaaf8;
      uStack_6a8 = 0x3e2aaaf83e2aaaf8;
      local_1b4 = 0x3fc90fdb;
      local_198 = 0x3fc90fdb;
      local_1b0 = 0x3fc90fdb;
      local_6c0 = 0x3fc90fdb3fc90fdb;
      uStack_6b8 = 0x3fc90fdb3fc90fdb;
      local_1d4 = 0x40490fdb;
      local_1b8 = 0x40490fdb;
      local_1d0 = 0x40490fdb;
      local_6d0 = 0x40490fdb40490fdb;
      uStack_6c8 = 0x40490fdb40490fdb;
      auVar12._8_8_ = 0x8000000080000000;
      auVar12._0_8_ = 0x8000000080000000;
      local_6e0 = vpand_avx(auVar12,auVar73);
      auVar33._8_8_ = 0x8000000080000000;
      auVar33._0_8_ = 0x8000000080000000;
      local_6f0 = vpandn_avx(auVar33,auVar73);
      local_2f0 = local_6f0._0_8_;
      uStack_2e8 = local_6f0._8_8_;
      auVar29._8_8_ = 0x3f0000003f000000;
      auVar29._0_8_ = 0x3f0000003f000000;
      local_700 = vcmpps_avx(local_6f0,auVar29,2);
      local_560 = local_6f0._0_8_;
      uStack_558 = local_6f0._8_8_;
      auVar14._8_8_ = 0x3f8000003f800000;
      auVar14._0_8_ = 0x3f8000003f800000;
      _local_4e0 = vsubps_avx(auVar14,local_6f0);
      local_4c0 = (float)local_4e0._0_4_ * 0.5;
      fStack_4bc = (float)local_4e0._4_4_ * 0.5;
      fStack_4b8 = fStack_4d8 * 0.5;
      fStack_4b4 = fStack_4d4 * 0.5;
      auVar15._4_4_ = fStack_4bc;
      auVar15._0_4_ = local_4c0;
      auVar15._8_4_ = fStack_4b8;
      auVar15._12_4_ = fStack_4b4;
      local_710 = vsqrtps_avx(auVar15);
      local_5b0 = local_700._0_8_;
      uStack_5a8 = local_700._8_8_;
      local_5c0 = local_6f0._0_8_;
      uStack_5b8 = local_6f0._8_8_;
      local_270 = vpand_avx(local_700,local_6f0);
      local_210 = local_700._0_8_;
      uStack_208 = local_700._8_8_;
      local_220 = local_710._0_8_;
      uStack_218 = local_710._8_8_;
      local_280 = vpandn_avx(local_700,local_710);
      local_720 = vpor_avx(local_270,local_280);
      local_500 = local_720._0_8_;
      uStack_4f8 = local_720._8_8_;
      local_4f0._0_4_ = local_720._0_4_;
      local_4f0._4_4_ = local_720._4_4_;
      uStack_4e8._0_4_ = local_720._8_4_;
      uStack_4e8._4_4_ = local_720._12_4_;
      local_730 = (float)local_4f0 * (float)local_4f0;
      fStack_72c = local_4f0._4_4_ * local_4f0._4_4_;
      fStack_728 = (float)uStack_4e8 * (float)uStack_4e8;
      fStack_724 = uStack_4e8._4_4_ * uStack_4e8._4_4_;
      local_520 = CONCAT44(fStack_72c,local_730);
      uStack_518 = CONCAT44(fStack_724,fStack_728);
      local_740 = local_730 * local_730;
      fStack_73c = fStack_72c * fStack_72c;
      fStack_738 = fStack_728 * fStack_728;
      fStack_734 = fStack_724 * fStack_724;
      local_440 = &local_740;
      local_400 = &local_670;
      local_408 = &local_690;
      local_3d0 = CONCAT44(fStack_73c,local_740);
      uStack_3c8 = CONCAT44(fStack_734,fStack_738);
      auVar48._4_4_ = fStack_73c;
      auVar48._0_4_ = local_740;
      auVar48._8_4_ = fStack_738;
      auVar48._12_4_ = fStack_734;
      local_3e0 = 0x3d2dbdcf3d2dbdcf;
      uStack_3d8 = 0x3d2dbdcf3d2dbdcf;
      auVar57._8_8_ = 0x3d2dbdcf3d2dbdcf;
      auVar57._0_8_ = 0x3d2dbdcf3d2dbdcf;
      local_3f0 = 0x3d3a73d83d3a73d8;
      uStack_3e8 = 0x3d3a73d83d3a73d8;
      auVar55._8_8_ = 0x3d3a73d83d3a73d8;
      auVar55._0_8_ = 0x3d3a73d83d3a73d8;
      local_770 = vfmadd213ps_fma(auVar57,auVar48,auVar55);
      local_418 = local_770;
      local_420 = &local_6b0;
      local_3a0 = CONCAT44(fStack_73c,local_740);
      uStack_398 = CONCAT44(fStack_734,fStack_738);
      auVar49._4_4_ = fStack_73c;
      auVar49._0_4_ = local_740;
      auVar49._8_4_ = fStack_738;
      auVar49._12_4_ = fStack_734;
      local_3b0 = local_770._0_8_;
      uStack_3a8 = local_770._8_8_;
      local_3c0 = 0x3e2aaaf83e2aaaf8;
      uStack_3b8 = 0x3e2aaaf83e2aaaf8;
      auVar53._8_8_ = 0x3e2aaaf83e2aaaf8;
      auVar53._0_8_ = 0x3e2aaaf83e2aaaf8;
      local_760 = vfmadd213ps_fma(local_770,auVar49,auVar53);
      local_430 = &local_660;
      local_438 = &local_680;
      local_370 = CONCAT44(fStack_73c,local_740);
      uStack_368 = CONCAT44(fStack_734,fStack_738);
      auVar50._4_4_ = fStack_73c;
      auVar50._0_4_ = local_740;
      auVar50._8_4_ = fStack_738;
      auVar50._12_4_ = fStack_734;
      local_380 = 0x3cc48f193cc48f19;
      uStack_378 = 0x3cc48f193cc48f19;
      auVar58._8_8_ = 0x3cc48f193cc48f19;
      auVar58._0_8_ = 0x3cc48f193cc48f19;
      local_390 = 0x3d997dcc3d997dcc;
      uStack_388 = 0x3d997dcc3d997dcc;
      auVar56._8_8_ = 0x3d997dcc3d997dcc;
      auVar56._0_8_ = 0x3d997dcc3d997dcc;
      local_790 = vfmadd213ps_fma(auVar58,auVar50,auVar56);
      local_448 = local_790;
      local_450 = &local_6a0;
      local_340 = CONCAT44(fStack_73c,local_740);
      uStack_338 = CONCAT44(fStack_734,fStack_738);
      auVar51._4_4_ = fStack_73c;
      auVar51._0_4_ = local_740;
      auVar51._8_4_ = fStack_738;
      auVar51._12_4_ = fStack_734;
      local_350 = local_790._0_8_;
      uStack_348 = local_790._8_8_;
      local_360 = 0x3f8000003f800000;
      uStack_358 = 0x3f8000003f800000;
      auVar54._8_8_ = 0x3f8000003f800000;
      auVar54._0_8_ = 0x3f8000003f800000;
      local_780 = vfmadd213ps_fma(local_790,auVar51,auVar54);
      local_458 = &local_730;
      local_460 = local_760;
      local_468 = local_780;
      local_310 = CONCAT44(fStack_72c,local_730);
      uStack_308 = CONCAT44(fStack_724,fStack_728);
      auVar52._4_4_ = fStack_72c;
      auVar52._0_4_ = local_730;
      auVar52._8_4_ = fStack_728;
      auVar52._12_4_ = fStack_724;
      local_320 = local_760._0_8_;
      uStack_318 = local_760._8_8_;
      local_330 = local_780._0_8_;
      uStack_328 = local_780._8_8_;
      local_750 = vfmadd213ps_fma(local_760,auVar52,local_780);
      local_540 = local_720._0_8_;
      uStack_538 = local_720._8_8_;
      local_530._0_4_ = local_750._0_4_;
      local_530._4_4_ = local_750._4_4_;
      uStack_528._0_4_ = local_750._8_4_;
      uStack_528._4_4_ = local_750._12_4_;
      local_7a0 = (float)local_530 * (float)local_4f0;
      fStack_79c = local_530._4_4_ * local_4f0._4_4_;
      fStack_798 = (float)uStack_528 * (float)uStack_4e8;
      fStack_794 = uStack_528._4_4_ * uStack_4e8._4_4_;
      local_290 = CONCAT44(fStack_79c,local_7a0);
      uStack_288 = CONCAT44(fStack_794,fStack_798);
      local_2a0 = local_6e0._0_8_;
      uStack_298 = local_6e0._8_8_;
      auVar31._8_8_ = uStack_288;
      auVar31._0_8_ = local_290;
      local_580 = vpor_avx(auVar31,local_6e0);
      auVar13._8_8_ = 0x3fc90fdb3fc90fdb;
      auVar13._0_8_ = 0x3fc90fdb3fc90fdb;
      local_7b0 = vsubps_avx(auVar13,local_580);
      local_5d0 = vcmpps_avx(auVar73,ZEXT816(0),1);
      auVar73._8_8_ = 0x40490fdb40490fdb;
      auVar73._0_8_ = 0x40490fdb40490fdb;
      _local_4a0 = vpand_avx(local_5d0,auVar73);
      local_490 = CONCAT44(fStack_79c,local_7a0);
      uStack_488 = CONCAT44(fStack_794,fStack_798);
      local_2b0 = local_7a0 + local_7a0;
      fStack_2ac = fStack_79c + fStack_79c;
      fStack_2a8 = fStack_798 + fStack_798;
      fStack_2a4 = fStack_794 + fStack_794;
      local_2c0 = local_6e0._0_8_;
      uStack_2b8 = local_6e0._8_8_;
      auVar30._4_4_ = fStack_2ac;
      auVar30._0_4_ = local_2b0;
      auVar30._8_4_ = fStack_2a8;
      auVar30._12_4_ = fStack_2a4;
      _local_4b0 = vpor_avx(auVar30,local_6e0);
      local_7c0 = (float)local_4a0._0_4_ + (float)local_4b0._0_4_;
      fStack_7bc = (float)local_4a0._4_4_ + (float)local_4b0._4_4_;
      fStack_7b8 = fStack_498 + fStack_4a8;
      fStack_7b4 = fStack_494 + fStack_4a4;
      local_5f0 = local_700._0_8_;
      uStack_5e8 = local_700._8_8_;
      local_600 = local_7b0._0_8_;
      uStack_5f8 = local_7b0._8_8_;
      local_2d0 = vpand_avx(local_700,local_7b0);
      local_230 = local_700._0_8_;
      uStack_228 = local_700._8_8_;
      local_240 = CONCAT44(fStack_7bc,local_7c0);
      uStack_238 = CONCAT44(fStack_7b4,fStack_7b8);
      auVar73 = vpternlogq_avx512vl(local_700,local_700,local_700,0xf);
      auVar32._8_8_ = uStack_238;
      auVar32._0_8_ = local_240;
      local_2e0 = vpand_avx(auVar73,auVar32);
      local_30b0 = vpor_avx(local_2d0,local_2e0);
      local_2ec0 = local_2ff0;
      local_2ed0 = local_30b0._0_8_;
      uStack_2ec8 = local_30b0._8_8_;
      *(undefined1 (*) [16])*local_2ff0 = local_30b0;
      local_2ff0 = (undefined1 (*) [64])(*local_2ff0 + 0x10);
      local_5e0 = local_6d0;
      uStack_5d8 = uStack_6c8;
      local_5a0 = local_610;
      uStack_598 = uStack_608;
      local_590 = local_620;
      uStack_588 = uStack_618;
      local_570 = local_6c0;
      uStack_568 = uStack_6b8;
      local_550 = local_650;
      uStack_548 = uStack_648;
      local_530 = local_750._0_8_;
      uStack_528 = local_750._8_8_;
      local_510 = local_520;
      uStack_508 = uStack_518;
      local_4f0 = local_500;
      uStack_4e8 = uStack_4f8;
      local_4d0 = local_640;
      uStack_4c8 = uStack_638;
      local_480 = local_490;
      uStack_478 = uStack_488;
      local_428 = local_440;
      local_410 = local_440;
      local_3f8 = local_440;
      local_300 = local_640;
      uStack_2f8 = uStack_638;
      local_260 = local_630;
      uStack_258 = uStack_628;
      local_250 = local_610;
      uStack_248 = uStack_608;
      local_200 = local_610;
      uStack_1f8 = uStack_608;
      local_1f0 = local_620;
      uStack_1e8 = uStack_618;
      uStack_1cc = local_1d0;
      uStack_1c8 = local_1d0;
      uStack_1c4 = local_1d0;
      uStack_1ac = local_1b0;
      uStack_1a8 = local_1b0;
      uStack_1a4 = local_1b0;
      uStack_18c = local_190;
      uStack_188 = local_190;
      uStack_184 = local_190;
      uStack_16c = local_170;
      uStack_168 = local_170;
      uStack_164 = local_170;
      uStack_14c = local_150;
      uStack_148 = local_150;
      uStack_144 = local_150;
      uStack_12c = local_130;
      uStack_128 = local_130;
      uStack_124 = local_130;
      uStack_10c = local_110;
      uStack_108 = local_110;
      uStack_104 = local_110;
      uStack_ec = local_f0;
      uStack_e8 = local_f0;
      uStack_e4 = local_f0;
      uStack_cc = local_d0;
      uStack_c8 = local_d0;
      uStack_c4 = local_d0;
      uStack_ac = local_b0;
      uStack_a8 = local_b0;
      uStack_a4 = local_b0;
      uStack_8c = local_90;
      uStack_88 = local_90;
      uStack_84 = local_90;
      uStack_6c = local_70;
      uStack_68 = local_70;
      uStack_64 = local_70;
    }
    for (; uStack_3048._4_4_ = uVar72, uStack_3050._4_4_ = uVar71, uStack_3058._4_4_ = uVar70,
        uStack_3060._4_4_ = uVar69, uStack_3068._4_4_ = uVar68, uStack_3070._4_4_ = uVar67,
        uStack_3078._4_4_ = uVar66, local_3080._4_4_ = uVar65, uStack_3048 = uVar64,
        uStack_3050 = uVar63, uStack_3058 = uVar62, uStack_3060 = uVar61, uStack_3068 = uVar60,
        uStack_3070 = uVar59, uStack_3078 = uVar11, local_3080 = uVar10, uVar72 = uStack_3048._4_4_,
        uVar71 = uStack_3050._4_4_, uVar70 = uStack_3058._4_4_, uVar69 = uStack_3060._4_4_,
        uVar68 = uStack_3068._4_4_, uVar67 = uStack_3070._4_4_, uVar66 = uStack_3078._4_4_,
        uVar65 = local_3080._4_4_, local_303c < local_2fe4; local_303c = local_303c + 1) {
      local_2e08 = local_2fc9;
      local_2e10 = local_2ff0;
      uVar10 = local_3080;
      local_3080._4_4_ = uVar65;
      uVar11 = uStack_3078;
      uStack_3078._4_4_ = uVar66;
      uVar59 = uStack_3070;
      uStack_3070._4_4_ = uVar67;
      uVar60 = uStack_3068;
      uStack_3068._4_4_ = uVar68;
      uVar61 = uStack_3060;
      uStack_3060._4_4_ = uVar69;
      uVar62 = uStack_3058;
      uStack_3058._4_4_ = uVar70;
      uVar63 = uStack_3050;
      uStack_3050._4_4_ = uVar71;
      uVar64 = uStack_3048;
      uStack_3048._4_4_ = uVar72;
      fVar77 = acosf(*(float *)*local_2ff0);
      uVar64 = uStack_3048;
      uVar63 = uStack_3050;
      uVar62 = uStack_3058;
      uVar61 = uStack_3060;
      uVar60 = uStack_3068;
      uVar59 = uStack_3070;
      uVar11 = uStack_3078;
      uVar10 = local_3080;
      *(float *)*local_2ff0 = fVar77;
      local_2ff0 = (undefined1 (*) [64])(*local_2ff0 + 4);
      uVar65 = local_3080._4_4_;
      uVar66 = uStack_3078._4_4_;
      uVar67 = uStack_3070._4_4_;
      uVar68 = uStack_3068._4_4_;
      uVar69 = uStack_3060._4_4_;
      uVar70 = uStack_3058._4_4_;
      uVar71 = uStack_3050._4_4_;
      uVar72 = uStack_3048._4_4_;
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}